

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx2::forward_inplace(TanH_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [24];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 (*pauVar61) [32];
  long in_RSI;
  double dVar62;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 two_2;
  __m256 one_6;
  __m256 two;
  __m256 one;
  __m128 two_3;
  __m128 one_9;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 one_7;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_8;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m128 one_4;
  __m128 one_10;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined1 (*in_stack_ffffffffffffd988) [16];
  undefined4 in_stack_ffffffffffffd990;
  undefined4 in_stack_ffffffffffffd994;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  int local_260c;
  Mat local_2608;
  undefined1 (*local_25c0) [32];
  int local_25b4;
  undefined1 local_25b0 [16];
  int local_259c;
  Mat local_2598;
  undefined1 (*local_2550) [16];
  int local_2544;
  undefined1 local_2540 [32];
  int local_2508;
  Mat local_24f8;
  undefined1 (*local_24b0) [32];
  int local_24a8;
  int local_24a4;
  int local_24a0;
  int local_249c;
  int local_2498;
  int local_2494;
  undefined1 (*local_2470) [32];
  undefined1 (*local_2468) [32];
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined1 (*local_2368) [32];
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 (*local_2328) [32];
  undefined1 (*local_2320) [32];
  undefined1 (*local_2318) [16];
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined1 (*local_2298) [32];
  undefined8 local_2290;
  undefined8 uStack_2288;
  undefined1 (*local_2278) [16];
  undefined4 local_2270;
  undefined4 local_226c;
  undefined4 local_2268;
  undefined4 local_2264;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined1 local_2220 [32];
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined1 local_21c0 [32];
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  undefined4 uStack_2164;
  undefined4 local_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  undefined4 uStack_2104;
  undefined4 local_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [16];
  undefined1 auStack_2050 [16];
  undefined4 local_2040;
  undefined4 local_203c;
  undefined4 local_2038;
  undefined4 local_2034;
  undefined4 local_2030;
  undefined4 local_202c;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined1 local_2020 [16];
  undefined1 auStack_2010 [16];
  undefined4 local_2000;
  undefined4 local_1ffc;
  undefined4 local_1ff8;
  undefined4 local_1ff4;
  undefined4 local_1ff0;
  undefined4 local_1fec;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined1 local_1fe0 [16];
  undefined1 auStack_1fd0 [16];
  undefined4 local_1fc0;
  undefined4 local_1fbc;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined4 local_1fb0;
  undefined4 local_1fac;
  undefined4 local_1fa8;
  undefined4 local_1fa4;
  undefined1 local_1fa0 [16];
  undefined1 auStack_1f90 [16];
  undefined4 local_1f80;
  undefined4 local_1f7c;
  undefined4 local_1f78;
  undefined4 local_1f74;
  undefined4 local_1f70;
  undefined4 local_1f6c;
  undefined4 local_1f68;
  undefined4 local_1f64;
  undefined1 local_1f60 [16];
  undefined1 auStack_1f50 [16];
  undefined4 local_1f40;
  undefined4 local_1f3c;
  undefined4 local_1f38;
  undefined4 local_1f34;
  undefined4 local_1f30;
  undefined4 local_1f2c;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined1 local_1f20 [16];
  undefined1 auStack_1f10 [16];
  undefined4 local_1f00;
  undefined4 local_1efc;
  undefined4 local_1ef8;
  undefined4 local_1ef4;
  undefined4 local_1ef0;
  undefined4 local_1eec;
  undefined4 local_1ee8;
  undefined4 local_1ee4;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  float local_1ec0;
  float fStack_1ebc;
  float fStack_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  float local_1e80;
  float fStack_1e7c;
  float fStack_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  float fStack_1e68;
  float fStack_1e64;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  float local_1e40;
  float fStack_1e3c;
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  float fStack_1e24;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00;
  float fStack_1dfc;
  float fStack_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  float fStack_1de8;
  float fStack_1de4;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined1 local_1d80 [32];
  undefined4 local_1d60;
  undefined4 uStack_1d5c;
  undefined4 uStack_1d58;
  undefined4 uStack_1d54;
  undefined4 uStack_1d50;
  undefined4 uStack_1d4c;
  undefined4 uStack_1d48;
  undefined4 uStack_1d44;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [8];
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined1 local_1d00 [8];
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined1 local_1ce0 [32];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined4 local_1ac0;
  undefined4 uStack_1abc;
  undefined4 uStack_1ab8;
  undefined4 uStack_1ab4;
  undefined4 uStack_1ab0;
  undefined4 uStack_1aac;
  undefined4 uStack_1aa8;
  undefined4 uStack_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined4 local_1a80;
  undefined4 uStack_1a7c;
  undefined4 uStack_1a78;
  undefined4 uStack_1a74;
  undefined4 uStack_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined4 local_1a40;
  undefined4 uStack_1a3c;
  undefined4 uStack_1a38;
  undefined4 uStack_1a34;
  undefined4 uStack_1a30;
  undefined4 uStack_1a2c;
  undefined4 uStack_1a28;
  undefined4 uStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined4 uStack_1970;
  undefined4 uStack_196c;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined4 local_1940;
  undefined4 uStack_193c;
  undefined4 uStack_1938;
  undefined4 uStack_1934;
  undefined4 uStack_1930;
  undefined4 uStack_192c;
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined4 local_1900;
  undefined4 uStack_18fc;
  undefined4 uStack_18f8;
  undefined4 uStack_18f4;
  undefined4 uStack_18f0;
  undefined4 uStack_18ec;
  undefined4 uStack_18e8;
  undefined4 uStack_18e4;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined4 uStack_18b0;
  undefined4 uStack_18ac;
  undefined4 uStack_18a8;
  undefined4 uStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined4 local_1880;
  undefined4 uStack_187c;
  undefined4 uStack_1878;
  undefined4 uStack_1874;
  undefined4 uStack_1870;
  undefined4 uStack_186c;
  undefined4 uStack_1868;
  undefined4 uStack_1864;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined4 local_1840;
  undefined4 uStack_183c;
  undefined4 uStack_1838;
  undefined4 uStack_1834;
  undefined4 uStack_1830;
  undefined4 uStack_182c;
  undefined4 uStack_1828;
  undefined4 uStack_1824;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined1 local_17a0 [32];
  undefined4 local_1780;
  undefined4 uStack_177c;
  undefined4 uStack_1778;
  undefined4 uStack_1774;
  undefined4 uStack_1770;
  undefined4 uStack_176c;
  undefined4 uStack_1768;
  undefined4 uStack_1764;
  undefined1 local_1760 [32];
  undefined1 local_1740 [8];
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined1 local_1720 [8];
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined1 local_1700 [32];
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined4 local_14e0;
  undefined4 uStack_14dc;
  undefined4 uStack_14d8;
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  undefined4 uStack_14c8;
  undefined4 uStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined4 local_14a0;
  undefined4 uStack_149c;
  undefined4 uStack_1498;
  undefined4 uStack_1494;
  undefined4 uStack_1490;
  undefined4 uStack_148c;
  undefined4 uStack_1488;
  undefined4 uStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined4 local_1460;
  undefined4 uStack_145c;
  undefined4 uStack_1458;
  undefined4 uStack_1454;
  undefined4 uStack_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1448;
  undefined4 uStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined4 local_13a0;
  undefined4 uStack_139c;
  undefined4 uStack_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined4 uStack_1388;
  undefined4 uStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined4 local_1320;
  undefined4 uStack_131c;
  undefined4 uStack_1318;
  undefined4 uStack_1314;
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined4 local_1260;
  undefined4 uStack_125c;
  undefined4 uStack_1258;
  undefined4 uStack_1254;
  undefined4 uStack_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  ulong uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  ulong uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined4 local_fa0;
  undefined4 uStack_f9c;
  undefined4 uStack_f98;
  undefined4 uStack_f94;
  undefined4 uStack_f90;
  undefined4 uStack_f8c;
  undefined4 uStack_f88;
  undefined4 uStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined4 local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  undefined4 uStack_f50;
  undefined4 uStack_f4c;
  undefined4 uStack_f48;
  undefined4 uStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined4 local_f20;
  undefined4 uStack_f1c;
  undefined4 uStack_f18;
  undefined4 uStack_f14;
  undefined4 uStack_f10;
  undefined4 uStack_f0c;
  undefined4 uStack_f08;
  undefined4 uStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined4 local_ee0;
  undefined4 uStack_edc;
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  undefined4 uStack_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined4 local_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined4 local_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined4 local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b88;
  undefined4 uStack_b84;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined4 local_b14;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [16];
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  undefined4 local_a30;
  undefined4 uStack_a2c;
  undefined4 uStack_a28;
  undefined4 uStack_a24;
  undefined4 local_a14;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  ulong uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined4 local_9b4;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  ulong uStack_998;
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  undefined4 local_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [8];
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_810 [16];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2494 = *(int *)(in_RSI + 0x2c);
  local_2498 = *(int *)(in_RSI + 0x30);
  local_249c = *(int *)(in_RSI + 0x38);
  local_24a0 = local_2494 * local_2498;
  local_24a4 = *(int *)(in_RSI + 0x18);
  if (local_24a4 == 8) {
    local_24a4 = 8;
    for (local_24a8 = 0; local_24a8 < local_249c; local_24a8 = local_24a8 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd994,in_stack_ffffffffffffd990),
                         (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
      pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_24f8);
      ncnn::Mat::~Mat((Mat *)0x51c054);
      local_24b0 = pauVar61;
      for (local_2508 = 0; local_2508 < local_24a0; local_2508 = local_2508 + 1) {
        local_2468 = local_24b0;
        auVar58 = *(undefined1 (*) [24])*local_24b0;
        uStack_23a8 = *(undefined8 *)(*local_24b0 + 0x18);
        local_2540._0_8_ = auVar58._0_8_;
        local_23c0 = local_2540._0_8_;
        local_2540._8_8_ = auVar58._8_8_;
        uStack_23b8 = local_2540._8_8_;
        local_2540._16_8_ = auVar58._16_8_;
        uStack_23b0 = local_2540._16_8_;
        local_226c = 0x3f800000;
        in_stack_ffffffffffffd994 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_1f60 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1f50 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_23e0 = local_1f60._0_8_;
        uStack_23d8 = local_1f60._8_8_;
        uStack_23d0 = auStack_1f50._0_8_;
        uStack_23c8 = auStack_1f50._8_8_;
        local_2270 = 0x40000000;
        local_1f00 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_1f20 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_1f10 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_2400 = local_1f20._0_8_;
        uStack_23f8 = local_1f20._8_8_;
        uStack_23f0 = auStack_1f10._0_8_;
        uStack_23e8 = auStack_1f10._8_8_;
        uVar8 = local_2540._0_8_;
        uVar9 = local_2540._8_8_;
        uVar10 = local_2540._16_8_;
        local_20c0._0_4_ = auVar58._0_4_;
        local_20c0._4_4_ = auVar58._4_4_;
        uStack_20b8._0_4_ = auVar58._8_4_;
        uStack_20b8._4_4_ = auVar58._12_4_;
        uStack_20b0._0_4_ = auVar58._16_4_;
        uStack_20b0._4_4_ = auVar58._20_4_;
        uStack_20a8._0_4_ = (float)uStack_23a8;
        uStack_20a8._4_4_ = (undefined4)((ulong)uStack_23a8 >> 0x20);
        uStack_2164 = uStack_20a8._4_4_;
        local_20e0._0_4_ = local_1f20._0_4_;
        local_20e0._4_4_ = local_1f20._4_4_;
        uStack_20d8._0_4_ = local_1f20._8_4_;
        uStack_20d8._4_4_ = local_1f20._12_4_;
        uStack_20d0._0_4_ = auStack_1f10._0_4_;
        uStack_20d0._4_4_ = auStack_1f10._4_4_;
        uStack_20c8._0_4_ = auStack_1f10._8_4_;
        local_2180 = (float)local_20c0 * (float)local_20e0;
        fStack_217c = local_20c0._4_4_ * local_20e0._4_4_;
        fStack_2178 = (float)uStack_20b8 * (float)uStack_20d8;
        fStack_2174 = uStack_20b8._4_4_ * uStack_20d8._4_4_;
        fStack_2170 = (float)uStack_20b0 * (float)uStack_20d0;
        fStack_216c = uStack_20b0._4_4_ * uStack_20d0._4_4_;
        fStack_2168 = (float)uStack_20a8 * (float)uStack_20c8;
        local_2144 = 0x3f800000;
        local_2000 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2020 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2010 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_21a0._0_4_ = local_2020._0_4_;
        local_1e80 = (float)local_21a0;
        local_21a0._4_4_ = local_2020._4_4_;
        fStack_1e7c = local_21a0._4_4_;
        uStack_2198._0_4_ = local_2020._8_4_;
        fStack_1e78 = (float)uStack_2198;
        uStack_2198._4_4_ = local_2020._12_4_;
        fStack_1e74 = uStack_2198._4_4_;
        uStack_2190._0_4_ = auStack_2010._0_4_;
        fStack_1e70 = (float)uStack_2190;
        uStack_2190._4_4_ = auStack_2010._4_4_;
        fStack_1e6c = uStack_2190._4_4_;
        uStack_2188._0_4_ = auStack_2010._8_4_;
        fStack_1e68 = (float)uStack_2188;
        uStack_2188._4_4_ = auStack_2010._12_4_;
        fStack_1e64 = uStack_2188._4_4_;
        local_1020 = ZEXT832(0) << 0x20;
        local_1040 = 0;
        local_fc0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1038 = local_fc0._8_8_;
        uStack_1030 = 0;
        uStack_1028 = 0;
        local_1060 = CONCAT44(fStack_217c,local_2180);
        uStack_1058 = CONCAT44(fStack_2174,fStack_2178);
        uStack_1050 = CONCAT44(fStack_216c,fStack_2170);
        uStack_1048 = CONCAT44(uStack_20a8._4_4_,fStack_2168);
        auVar26._8_8_ = uStack_1058;
        auVar26._0_8_ = local_1060;
        auVar26._16_8_ = uStack_1050;
        auVar26._24_8_ = uStack_1048;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_fc0._8_8_) << 0x40,auVar26);
        local_1780 = 0x3f800000;
        uStack_177c = 0x3f800000;
        uStack_1778 = 0x3f800000;
        uStack_1774 = 0x3f800000;
        uStack_1770 = 0x3f800000;
        uStack_176c = 0x3f800000;
        uStack_1768 = 0x3f800000;
        uStack_1764 = 0x3f800000;
        local_1700._0_8_ = auVar6._0_8_;
        local_f80 = local_1700._0_8_;
        local_1700._8_8_ = auVar6._8_8_;
        uStack_f78 = local_1700._8_8_;
        local_1700._16_8_ = auVar6._16_8_;
        uStack_f70 = local_1700._16_8_;
        local_1700._24_8_ = auVar6._24_8_;
        uStack_f68 = local_1700._24_8_;
        local_fa0 = 0x42b0c0a5;
        uStack_f9c = 0x42b0c0a5;
        uStack_f98 = 0x42b0c0a5;
        uStack_f94 = 0x42b0c0a5;
        uStack_f90 = 0x42b0c0a5;
        uStack_f8c = 0x42b0c0a5;
        uStack_f88 = 0x42b0c0a5;
        uStack_f84 = 0x42b0c0a5;
        auVar27._8_4_ = 0x42b0c0a5;
        auVar27._0_8_ = 0x42b0c0a542b0c0a5;
        auVar27._12_4_ = 0x42b0c0a5;
        auVar27._16_4_ = 0x42b0c0a5;
        auVar27._20_4_ = 0x42b0c0a5;
        auVar27._24_4_ = 0x42b0c0a5;
        auVar27._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar27);
        local_1700._0_8_ = auVar6._0_8_;
        local_f00 = local_1700._0_8_;
        local_1700._8_8_ = auVar6._8_8_;
        uStack_ef8 = local_1700._8_8_;
        local_1700._16_8_ = auVar6._16_8_;
        uStack_ef0 = local_1700._16_8_;
        local_1700._24_8_ = auVar6._24_8_;
        uStack_ee8 = local_1700._24_8_;
        local_f20 = 0xc2b0c0a5;
        uStack_f1c = 0xc2b0c0a5;
        uStack_f18 = 0xc2b0c0a5;
        uStack_f14 = 0xc2b0c0a5;
        uStack_f10 = 0xc2b0c0a5;
        uStack_f0c = 0xc2b0c0a5;
        uStack_f08 = 0xc2b0c0a5;
        uStack_f04 = 0xc2b0c0a5;
        auVar29._8_4_ = 0xc2b0c0a5;
        auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar29._12_4_ = 0xc2b0c0a5;
        auVar29._16_4_ = 0xc2b0c0a5;
        auVar29._20_4_ = 0xc2b0c0a5;
        auVar29._24_4_ = 0xc2b0c0a5;
        auVar29._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar29);
        local_1700._0_8_ = auVar4._0_8_;
        uVar11 = local_1700._0_8_;
        local_1700._8_8_ = auVar4._8_8_;
        uVar12 = local_1700._8_8_;
        local_1700._16_8_ = auVar4._16_8_;
        uVar13 = local_1700._16_8_;
        local_1700._24_8_ = auVar4._24_8_;
        uVar14 = local_1700._24_8_;
        local_1460 = 0x3fb8aa3b;
        uStack_145c = 0x3fb8aa3b;
        uStack_1458 = 0x3fb8aa3b;
        uStack_1454 = 0x3fb8aa3b;
        uStack_1450 = 0x3fb8aa3b;
        uStack_144c = 0x3fb8aa3b;
        uStack_1448 = 0x3fb8aa3b;
        uStack_1444 = 0x3fb8aa3b;
        local_1440._0_4_ = auVar4._0_4_;
        local_1440._4_4_ = auVar4._4_4_;
        uStack_1438._0_4_ = auVar4._8_4_;
        uStack_1438._4_4_ = auVar4._12_4_;
        uStack_1430._0_4_ = auVar4._16_4_;
        uStack_1430._4_4_ = auVar4._20_4_;
        uStack_1428._0_4_ = auVar4._24_4_;
        uStack_1428._4_4_ = auVar4._28_4_;
        local_1740._4_4_ = local_1440._4_4_ * 1.442695;
        local_1740._0_4_ = (float)local_1440 * 1.442695;
        uStack_1738._0_4_ = (float)uStack_1438 * 1.442695;
        uStack_1738._4_4_ = uStack_1438._4_4_ * 1.442695;
        uStack_1730._0_4_ = (float)uStack_1430 * 1.442695;
        uStack_1730._4_4_ = uStack_1430._4_4_ * 1.442695;
        auVar58 = _local_1740;
        uStack_1728._0_4_ = (float)uStack_1428 * 1.442695;
        uStack_1728._4_4_ = uStack_1428._4_4_;
        auVar6 = _local_1740;
        local_1240 = local_1740;
        uStack_1238 = uStack_1738;
        uStack_1730 = auVar58._16_8_;
        uStack_1230 = uStack_1730;
        uStack_1728 = auVar6._24_8_;
        uStack_1228 = uStack_1728;
        local_1260 = 0x3f000000;
        uStack_125c = 0x3f000000;
        uStack_1258 = 0x3f000000;
        uStack_1254 = 0x3f000000;
        uStack_1250 = 0x3f000000;
        uStack_124c = 0x3f000000;
        uStack_1248 = 0x3f000000;
        uStack_1244 = 0x3f000000;
        local_1740._4_4_ = local_1440._4_4_ * 1.442695 + 0.5;
        local_1740._0_4_ = (float)local_1440 * 1.442695 + 0.5;
        uStack_1738._0_4_ = (float)uStack_1438 * 1.442695 + 0.5;
        uStack_1738._4_4_ = uStack_1438._4_4_ * 1.442695 + 0.5;
        uStack_1730._0_4_ = (float)uStack_1430 * 1.442695 + 0.5;
        uStack_1730._4_4_ = uStack_1430._4_4_ * 1.442695 + 0.5;
        uStack_1728._0_4_ = (float)uStack_1428 * 1.442695 + 0.5;
        uStack_1728._4_4_ = uStack_1428._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1740,1);
        auVar6 = vcmpps_avx(_local_1740,auVar5,1);
        local_17a0._0_8_ = auVar6._0_8_;
        local_e80 = local_17a0._0_8_;
        local_17a0._8_8_ = auVar6._8_8_;
        uStack_e78 = local_17a0._8_8_;
        local_17a0._16_8_ = auVar6._16_8_;
        uStack_e70 = local_17a0._16_8_;
        local_17a0._24_8_ = auVar6._24_8_;
        uStack_e68 = local_17a0._24_8_;
        local_ea0 = 0x3f8000003f800000;
        uStack_e98 = 0x3f8000003f800000;
        uStack_e90 = 0x3f8000003f800000;
        uStack_e88 = 0x3f8000003f800000;
        auVar31._8_8_ = 0x3f8000003f800000;
        auVar31._0_8_ = 0x3f8000003f800000;
        auVar31._16_8_ = 0x3f8000003f800000;
        auVar31._24_8_ = 0x3f8000003f800000;
        local_17a0 = vpand_avx2(auVar6,auVar31);
        local_1720 = auVar5._0_8_;
        local_1180 = local_1720;
        uStack_1718 = auVar5._8_8_;
        uStack_1178 = uStack_1718;
        uStack_1710 = auVar5._16_8_;
        uStack_1170 = uStack_1710;
        uStack_1708 = auVar5._24_8_;
        uStack_1168 = uStack_1708;
        local_11a0 = local_17a0._0_8_;
        uStack_1198 = local_17a0._8_8_;
        uStack_1190 = local_17a0._16_8_;
        uStack_1188 = local_17a0._24_8_;
        _local_1740 = vsubps_avx(auVar5,local_17a0);
        local_14a0 = 0x3f318000;
        uStack_149c = 0x3f318000;
        uStack_1498 = 0x3f318000;
        uStack_1494 = 0x3f318000;
        uStack_1490 = 0x3f318000;
        uStack_148c = 0x3f318000;
        uStack_1488 = 0x3f318000;
        uStack_1484 = 0x3f318000;
        local_1480._0_4_ = local_1740._0_4_;
        local_1480._4_4_ = local_1740._4_4_;
        uStack_1478._0_4_ = local_1740._8_4_;
        uStack_1478._4_4_ = local_1740._12_4_;
        uStack_1470._0_4_ = local_1740._16_4_;
        uStack_1470._4_4_ = local_1740._20_4_;
        uStack_1468._0_4_ = local_1740._24_4_;
        uStack_1468._4_4_ = local_1740._28_4_;
        local_1720._4_4_ = local_1480._4_4_ * 0.6933594;
        local_1720._0_4_ = (float)local_1480 * 0.6933594;
        uStack_1718._0_4_ = (float)uStack_1478 * 0.6933594;
        uStack_1718._4_4_ = uStack_1478._4_4_ * 0.6933594;
        uStack_1710._0_4_ = (float)uStack_1470 * 0.6933594;
        uStack_1710._4_4_ = uStack_1470._4_4_ * 0.6933594;
        auVar58 = _local_1720;
        uStack_1708._0_4_ = (float)uStack_1468 * 0.6933594;
        uStack_1708._4_4_ = uStack_1468._4_4_;
        auVar5 = _local_1720;
        local_14c0 = local_1740;
        uStack_14b8 = uStack_1738;
        uStack_14b0 = uStack_1730;
        uStack_14a8 = uStack_1728;
        local_14e0 = 0xb95e8083;
        uStack_14dc = 0xb95e8083;
        uStack_14d8 = 0xb95e8083;
        uStack_14d4 = 0xb95e8083;
        uStack_14d0 = 0xb95e8083;
        uStack_14cc = 0xb95e8083;
        uStack_14c8 = 0xb95e8083;
        uStack_14c4 = 0xb95e8083;
        local_11c0 = local_1700._0_8_;
        uStack_11b8 = local_1700._8_8_;
        uStack_11b0 = local_1700._16_8_;
        uStack_11a8 = local_1700._24_8_;
        local_11e0 = local_1720;
        uStack_11d8 = uStack_1718;
        uStack_1710 = auVar58._16_8_;
        uStack_11d0 = uStack_1710;
        uStack_1708 = auVar5._24_8_;
        uStack_11c8 = uStack_1708;
        auVar22._16_8_ = uStack_1710;
        auVar22._0_16_ = _local_1720;
        auVar22._24_8_ = uStack_1708;
        auVar6 = vsubps_avx(auVar4,auVar22);
        local_1700._0_8_ = auVar6._0_8_;
        local_1200 = local_1700._0_8_;
        local_1700._8_8_ = auVar6._8_8_;
        uStack_11f8 = local_1700._8_8_;
        local_1700._16_8_ = auVar6._16_8_;
        uStack_11f0 = local_1700._16_8_;
        local_1700._24_8_ = auVar6._24_8_;
        uStack_11e8 = local_1700._24_8_;
        local_1220 = CONCAT44(local_1480._4_4_ * -0.00021219444,(float)local_1480 * -0.00021219444);
        uStack_1218 = CONCAT44(uStack_1478._4_4_ * -0.00021219444,
                               (float)uStack_1478 * -0.00021219444);
        uStack_1210 = CONCAT44(uStack_1470._4_4_ * -0.00021219444,
                               (float)uStack_1470 * -0.00021219444);
        uStack_1208 = CONCAT44(uStack_1468._4_4_,(float)uStack_1468 * -0.00021219444);
        auVar21._8_8_ = uStack_1218;
        auVar21._0_8_ = local_1220;
        auVar21._16_8_ = uStack_1210;
        auVar21._24_8_ = uStack_1208;
        local_1700 = vsubps_avx(auVar6,auVar21);
        local_1520 = local_1700._0_8_;
        uStack_1518 = local_1700._8_8_;
        uStack_1510 = local_1700._16_8_;
        uStack_1508 = local_1700._24_8_;
        local_1500._0_4_ = local_1700._0_4_;
        local_1500._4_4_ = local_1700._4_4_;
        uStack_14f8._0_4_ = local_1700._8_4_;
        uStack_14f8._4_4_ = local_1700._12_4_;
        uStack_14f0._0_4_ = local_1700._16_4_;
        uStack_14f0._4_4_ = local_1700._20_4_;
        uStack_14e8._0_4_ = local_1700._24_4_;
        uStack_14e8._4_4_ = local_1700._28_4_;
        fStack_17a4 = uStack_14e8._4_4_;
        local_17c0 = (float)local_1500 * (float)local_1500;
        fStack_17bc = local_1500._4_4_ * local_1500._4_4_;
        fStack_17b8 = (float)uStack_14f8 * (float)uStack_14f8;
        fStack_17b4 = uStack_14f8._4_4_ * uStack_14f8._4_4_;
        fStack_17b0 = (float)uStack_14f0 * (float)uStack_14f0;
        fStack_17ac = uStack_14f0._4_4_ * uStack_14f0._4_4_;
        fStack_17a8 = (float)uStack_14e8 * (float)uStack_14e8;
        local_1540 = 0x3950696739506967;
        uStack_1538 = 0x3950696739506967;
        uStack_1530 = 0x3950696739506967;
        uStack_1528 = 0x3950696739506967;
        local_1560 = local_1700._0_8_;
        uStack_1558 = local_1700._8_8_;
        uStack_1550 = local_1700._16_8_;
        uStack_1548 = local_1700._24_8_;
        local_1280 = CONCAT44(local_1500._4_4_ * 0.00019875691,(float)local_1500 * 0.00019875691);
        uStack_1278 = CONCAT44(uStack_14f8._4_4_ * 0.00019875691,(float)uStack_14f8 * 0.00019875691)
        ;
        uStack_1270 = CONCAT44(uStack_14f0._4_4_ * 0.00019875691,(float)uStack_14f0 * 0.00019875691)
        ;
        uStack_1268 = CONCAT44(0x39506967,(float)uStack_14e8 * 0.00019875691);
        local_12a0 = 0x3ab743ce;
        uStack_129c = 0x3ab743ce;
        uStack_1298 = 0x3ab743ce;
        uStack_1294 = 0x3ab743ce;
        uStack_1290 = 0x3ab743ce;
        uStack_128c = 0x3ab743ce;
        uStack_1288 = 0x3ab743ce;
        uStack_1284 = 0x3ab743ce;
        local_17e0 = (float)local_1500 * 0.00019875691 + 0.0013981999;
        fStack_17dc = local_1500._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_17d8 = (float)uStack_14f8 * 0.00019875691 + 0.0013981999;
        fStack_17d4 = uStack_14f8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_17d0 = (float)uStack_14f0 * 0.00019875691 + 0.0013981999;
        fStack_17cc = uStack_14f0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_17c8 = (float)uStack_14e8 * 0.00019875691 + 0.0013981999;
        local_1580 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1578 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1570 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1568 = CONCAT44(0x3ad150fb,fStack_17c8);
        local_15a0 = local_1700._0_8_;
        uStack_1598 = local_1700._8_8_;
        uStack_1590 = local_1700._16_8_;
        uStack_1588 = local_1700._24_8_;
        local_17e0 = local_17e0 * (float)local_1500;
        fStack_17dc = fStack_17dc * local_1500._4_4_;
        fStack_17d8 = fStack_17d8 * (float)uStack_14f8;
        fStack_17d4 = fStack_17d4 * uStack_14f8._4_4_;
        fStack_17d0 = fStack_17d0 * (float)uStack_14f0;
        fStack_17cc = fStack_17cc * uStack_14f0._4_4_;
        fStack_17c8 = fStack_17c8 * (float)uStack_14e8;
        local_12c0 = CONCAT44(fStack_17dc,local_17e0);
        uStack_12b8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_12b0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_12a8 = CONCAT44(0x3ad150fb,fStack_17c8);
        local_12e0 = 0x3c088908;
        uStack_12dc = 0x3c088908;
        uStack_12d8 = 0x3c088908;
        uStack_12d4 = 0x3c088908;
        uStack_12d0 = 0x3c088908;
        uStack_12cc = 0x3c088908;
        uStack_12c8 = 0x3c088908;
        uStack_12c4 = 0x3c088908;
        local_17e0 = local_17e0 + 0.008333452;
        fStack_17dc = fStack_17dc + 0.008333452;
        fStack_17d8 = fStack_17d8 + 0.008333452;
        fStack_17d4 = fStack_17d4 + 0.008333452;
        fStack_17d0 = fStack_17d0 + 0.008333452;
        fStack_17cc = fStack_17cc + 0.008333452;
        fStack_17c8 = fStack_17c8 + 0.008333452;
        local_15c0 = CONCAT44(fStack_17dc,local_17e0);
        uStack_15b8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_15b0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_15a8 = CONCAT44(0x3c22b327,fStack_17c8);
        local_15e0 = local_1700._0_8_;
        uStack_15d8 = local_1700._8_8_;
        uStack_15d0 = local_1700._16_8_;
        uStack_15c8 = local_1700._24_8_;
        local_17e0 = local_17e0 * (float)local_1500;
        fStack_17dc = fStack_17dc * local_1500._4_4_;
        fStack_17d8 = fStack_17d8 * (float)uStack_14f8;
        fStack_17d4 = fStack_17d4 * uStack_14f8._4_4_;
        fStack_17d0 = fStack_17d0 * (float)uStack_14f0;
        fStack_17cc = fStack_17cc * uStack_14f0._4_4_;
        fStack_17c8 = fStack_17c8 * (float)uStack_14e8;
        local_1300 = CONCAT44(fStack_17dc,local_17e0);
        uStack_12f8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_12f0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_12e8 = CONCAT44(0x3c22b327,fStack_17c8);
        local_1320 = 0x3d2aa9c1;
        uStack_131c = 0x3d2aa9c1;
        uStack_1318 = 0x3d2aa9c1;
        uStack_1314 = 0x3d2aa9c1;
        uStack_1310 = 0x3d2aa9c1;
        uStack_130c = 0x3d2aa9c1;
        uStack_1308 = 0x3d2aa9c1;
        uStack_1304 = 0x3d2aa9c1;
        local_17e0 = local_17e0 + 0.041665796;
        fStack_17dc = fStack_17dc + 0.041665796;
        fStack_17d8 = fStack_17d8 + 0.041665796;
        fStack_17d4 = fStack_17d4 + 0.041665796;
        fStack_17d0 = fStack_17d0 + 0.041665796;
        fStack_17cc = fStack_17cc + 0.041665796;
        fStack_17c8 = fStack_17c8 + 0.041665796;
        local_1600 = CONCAT44(fStack_17dc,local_17e0);
        uStack_15f8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_15f0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_15e8 = CONCAT44(0x3d53568b,fStack_17c8);
        local_1620 = local_1700._0_8_;
        uStack_1618 = local_1700._8_8_;
        uStack_1610 = local_1700._16_8_;
        uStack_1608 = local_1700._24_8_;
        local_17e0 = local_17e0 * (float)local_1500;
        fStack_17dc = fStack_17dc * local_1500._4_4_;
        fStack_17d8 = fStack_17d8 * (float)uStack_14f8;
        fStack_17d4 = fStack_17d4 * uStack_14f8._4_4_;
        fStack_17d0 = fStack_17d0 * (float)uStack_14f0;
        fStack_17cc = fStack_17cc * uStack_14f0._4_4_;
        fStack_17c8 = fStack_17c8 * (float)uStack_14e8;
        local_1340 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1338 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1330 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1328 = CONCAT44(0x3d53568b,fStack_17c8);
        local_1360 = 0x3e2aaaaa;
        uStack_135c = 0x3e2aaaaa;
        uStack_1358 = 0x3e2aaaaa;
        uStack_1354 = 0x3e2aaaaa;
        uStack_1350 = 0x3e2aaaaa;
        uStack_134c = 0x3e2aaaaa;
        uStack_1348 = 0x3e2aaaaa;
        uStack_1344 = 0x3e2aaaaa;
        local_17e0 = local_17e0 + 0.16666666;
        fStack_17dc = fStack_17dc + 0.16666666;
        fStack_17d8 = fStack_17d8 + 0.16666666;
        fStack_17d4 = fStack_17d4 + 0.16666666;
        fStack_17d0 = fStack_17d0 + 0.16666666;
        fStack_17cc = fStack_17cc + 0.16666666;
        fStack_17c8 = fStack_17c8 + 0.16666666;
        local_1640 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1638 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1630 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1628 = CONCAT44(0x3e5f804d,fStack_17c8);
        local_1660 = local_1700._0_8_;
        uStack_1658 = local_1700._8_8_;
        uStack_1650 = local_1700._16_8_;
        uStack_1648 = local_1700._24_8_;
        local_17e0 = local_17e0 * (float)local_1500;
        fStack_17dc = fStack_17dc * local_1500._4_4_;
        fStack_17d8 = fStack_17d8 * (float)uStack_14f8;
        fStack_17d4 = fStack_17d4 * uStack_14f8._4_4_;
        fStack_17d0 = fStack_17d0 * (float)uStack_14f0;
        fStack_17cc = fStack_17cc * uStack_14f0._4_4_;
        fStack_17c8 = fStack_17c8 * (float)uStack_14e8;
        local_1380 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1378 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1370 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1368 = CONCAT44(0x3e5f804d,fStack_17c8);
        local_13a0 = 0x3f000000;
        uStack_139c = 0x3f000000;
        uStack_1398 = 0x3f000000;
        uStack_1394 = 0x3f000000;
        uStack_1390 = 0x3f000000;
        uStack_138c = 0x3f000000;
        uStack_1388 = 0x3f000000;
        uStack_1384 = 0x3f000000;
        local_17e0 = local_17e0 + 0.5;
        fStack_17dc = fStack_17dc + 0.5;
        fStack_17d8 = fStack_17d8 + 0.5;
        fStack_17d4 = fStack_17d4 + 0.5;
        fStack_17d0 = fStack_17d0 + 0.5;
        fStack_17cc = fStack_17cc + 0.5;
        fStack_17c8 = fStack_17c8 + 0.5;
        local_1680 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1678 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1670 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1668 = CONCAT44(0x3f37e013,fStack_17c8);
        local_16a0 = CONCAT44(fStack_17bc,local_17c0);
        uStack_1698 = CONCAT44(fStack_17b4,fStack_17b8);
        uStack_1690 = CONCAT44(fStack_17ac,fStack_17b0);
        uStack_1688 = CONCAT44(uStack_14e8._4_4_,fStack_17a8);
        local_17e0 = local_17e0 * local_17c0;
        fStack_17dc = fStack_17dc * fStack_17bc;
        fStack_17d8 = fStack_17d8 * fStack_17b8;
        fStack_17d4 = fStack_17d4 * fStack_17b4;
        fStack_17d0 = fStack_17d0 * fStack_17b0;
        fStack_17cc = fStack_17cc * fStack_17ac;
        fStack_17c8 = fStack_17c8 * fStack_17a8;
        local_13c0 = CONCAT44(fStack_17dc,local_17e0);
        uStack_13b8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_13b0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_13a8 = CONCAT44(0x3f37e013,fStack_17c8);
        local_13e0 = local_1700._0_8_;
        uStack_13d8 = local_1700._8_8_;
        uStack_13d0 = local_1700._16_8_;
        uStack_13c8 = local_1700._24_8_;
        local_17e0 = local_17e0 + (float)local_1500;
        fStack_17dc = fStack_17dc + local_1500._4_4_;
        fStack_17d8 = fStack_17d8 + (float)uStack_14f8;
        fStack_17d4 = fStack_17d4 + uStack_14f8._4_4_;
        fStack_17d0 = fStack_17d0 + (float)uStack_14f0;
        fStack_17cc = fStack_17cc + uStack_14f0._4_4_;
        fStack_17c8 = fStack_17c8 + (float)uStack_14e8;
        local_1400 = CONCAT44(fStack_17dc,local_17e0);
        uStack_13f8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_13f0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_13e8 = CONCAT44(uStack_14e8._4_4_ + 0.71826285,fStack_17c8);
        local_1420 = 0x3f8000003f800000;
        uStack_1418 = 0x3f8000003f800000;
        uStack_1410 = 0x3f8000003f800000;
        uStack_1408 = 0x3f8000003f800000;
        local_17e0 = local_17e0 + 1.0;
        fStack_17dc = fStack_17dc + 1.0;
        fStack_17d8 = fStack_17d8 + 1.0;
        fStack_17d4 = fStack_17d4 + 1.0;
        fStack_17d0 = fStack_17d0 + 1.0;
        fStack_17cc = fStack_17cc + 1.0;
        fStack_17c8 = fStack_17c8 + 1.0;
        fStack_17c4 = uStack_14e8._4_4_ + 0.71826285 + 1.0;
        local_e20 = local_1740;
        uStack_e18 = uStack_1738;
        uStack_e10 = uStack_1730;
        uStack_e08 = uStack_1728;
        local_1760._4_4_ = (int)local_1480._4_4_;
        local_1760._0_4_ = (int)(float)local_1480;
        local_1760._8_4_ = (int)(float)uStack_1478;
        local_1760._12_4_ = (int)uStack_1478._4_4_;
        local_1760._16_4_ = (int)(float)uStack_1470;
        local_1760._20_4_ = (int)uStack_1470._4_4_;
        auVar58 = local_1760._0_24_;
        local_1760._24_4_ = (int)(float)uStack_1468;
        local_1760._28_4_ = (int)uStack_1468._4_4_;
        auVar6 = local_1760;
        local_dc0 = local_1760._0_8_;
        uStack_db8 = local_1760._8_8_;
        local_1760._16_8_ = auVar58._16_8_;
        uStack_db0 = local_1760._16_8_;
        local_1760._24_8_ = auVar6._24_8_;
        uStack_da8 = local_1760._24_8_;
        local_de0 = 0x7f0000007f;
        uStack_dd8 = 0x7f0000007f;
        uStack_dd0 = 0x7f0000007f;
        uStack_dc8 = 0x7f0000007f;
        local_c40 = local_1760._0_8_;
        uStack_c38 = local_1760._8_8_;
        uStack_c30 = local_1760._16_8_;
        uStack_c28 = local_1760._24_8_;
        local_c60 = 0x7f0000007f;
        uStack_c58 = 0x7f0000007f;
        uStack_c50 = 0x7f0000007f;
        uStack_c48 = 0x7f0000007f;
        auVar36._16_8_ = local_1760._16_8_;
        auVar36._0_16_ = local_1760._0_16_;
        auVar36._24_8_ = local_1760._24_8_;
        auVar35._8_8_ = 0x7f0000007f;
        auVar35._0_8_ = 0x7f0000007f;
        auVar35._16_8_ = 0x7f0000007f;
        auVar35._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar36,auVar35);
        local_1760._0_8_ = auVar6._0_8_;
        local_d40 = local_1760._0_8_;
        local_1760._8_8_ = auVar6._8_8_;
        uStack_d38 = local_1760._8_8_;
        local_1760._16_8_ = auVar6._16_8_;
        uStack_d30 = local_1760._16_8_;
        local_1760._24_8_ = auVar6._24_8_;
        uStack_d28 = local_1760._24_8_;
        local_d44 = 0x17;
        local_bc0 = local_1760._0_8_;
        uStack_bb8 = local_1760._8_8_;
        uStack_bb0 = local_1760._16_8_;
        uStack_ba8 = local_1760._24_8_;
        local_bc4 = 0x17;
        local_1760 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_ce0 = local_1760._0_8_;
        uStack_cd8 = local_1760._8_8_;
        uStack_cd0 = local_1760._16_8_;
        uStack_cc8 = local_1760._24_8_;
        local_1800 = local_1760._0_8_;
        uStack_17f8 = local_1760._8_8_;
        uStack_17f0 = local_1760._16_8_;
        uStack_17e8 = local_1760._24_8_;
        local_16c0 = CONCAT44(fStack_17dc,local_17e0);
        uStack_16b8 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_16b0 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_16a8 = CONCAT44(fStack_17c4,fStack_17c8);
        local_16e0._0_4_ = local_1760._0_4_;
        local_16e0._4_4_ = local_1760._4_4_;
        uStack_16d8._0_4_ = local_1760._8_4_;
        uStack_16d8._4_4_ = local_1760._12_4_;
        uStack_16d0._0_4_ = local_1760._16_4_;
        uStack_16d0._4_4_ = local_1760._20_4_;
        uStack_16c8._0_4_ = local_1760._24_4_;
        local_17e0 = local_17e0 * (float)local_16e0;
        fStack_17dc = fStack_17dc * local_16e0._4_4_;
        fStack_17d8 = fStack_17d8 * (float)uStack_16d8;
        fStack_17d4 = fStack_17d4 * uStack_16d8._4_4_;
        fStack_17d0 = fStack_17d0 * (float)uStack_16d0;
        fStack_17cc = fStack_17cc * uStack_16d0._4_4_;
        fStack_17c8 = fStack_17c8 * (float)uStack_16c8;
        local_1e20 = CONCAT44(fStack_17dc,local_17e0);
        uStack_1e18 = CONCAT44(fStack_17d4,fStack_17d8);
        uStack_1e10 = CONCAT44(fStack_17cc,fStack_17d0);
        uStack_1e08 = CONCAT44(fStack_17c4,fStack_17c8);
        local_1ea0 = (float)local_21a0 + local_17e0;
        fStack_1e9c = local_21a0._4_4_ + fStack_17dc;
        fStack_1e98 = (float)uStack_2198 + fStack_17d8;
        fStack_1e94 = uStack_2198._4_4_ + fStack_17d4;
        fStack_1e90 = (float)uStack_2190 + fStack_17d0;
        fStack_1e8c = uStack_2190._4_4_ + fStack_17cc;
        fStack_1e88 = (float)uStack_2188 + fStack_17c8;
        fStack_1e84 = uStack_2188._4_4_ + fStack_17c4;
        auVar20._16_4_ = (float)uStack_2190;
        auVar20._0_16_ = local_2020;
        auVar20._20_4_ = uStack_2190._4_4_;
        auVar20._24_4_ = (float)uStack_2188;
        auVar20._28_4_ = uStack_2188._4_4_;
        auVar19._4_4_ = fStack_1e9c;
        auVar19._0_4_ = local_1ea0;
        auVar19._8_4_ = fStack_1e98;
        auVar19._12_4_ = fStack_1e94;
        auVar19._16_4_ = fStack_1e90;
        auVar19._20_4_ = fStack_1e8c;
        auVar19._24_4_ = fStack_1e88;
        auVar19._28_4_ = fStack_1e84;
        auVar6 = vrcpps_avx(auVar19);
        auVar7._4_4_ = local_21a0._4_4_ * auVar6._4_4_;
        auVar7._0_4_ = (float)local_21a0 * auVar6._0_4_;
        auVar7._8_4_ = (float)uStack_2198 * auVar6._8_4_;
        auVar7._12_4_ = uStack_2198._4_4_ * auVar6._12_4_;
        auVar7._16_4_ = (float)uStack_2190 * auVar6._16_4_;
        auVar7._20_4_ = uStack_2190._4_4_ * auVar6._20_4_;
        auVar7._24_4_ = (float)uStack_2188 * auVar6._24_4_;
        auVar7._28_4_ = uStack_2188._4_4_;
        auVar2 = vfmsub213ps_fma(auVar7,auVar19,auVar20);
        auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar6,auVar7);
        local_2240 = local_1f20._0_8_;
        uStack_2238 = local_1f20._8_8_;
        uStack_2230 = auStack_1f10._0_8_;
        uStack_2228 = auStack_1f10._8_8_;
        local_2260 = local_1f60._0_8_;
        uStack_2258 = local_1f60._8_8_;
        uStack_2250 = auStack_1f50._0_8_;
        uStack_2248 = auStack_1f50._8_8_;
        local_2220 = ZEXT1632(auVar2);
        auVar16._16_8_ = auStack_1f10._0_8_;
        auVar16._0_16_ = local_1f20;
        auVar16._24_8_ = auStack_1f10._8_8_;
        auVar15._16_8_ = auStack_1f50._0_8_;
        auVar15._0_16_ = local_1f60;
        auVar15._24_8_ = auStack_1f50._8_8_;
        auVar63._8_4_ = 0x80000000;
        auVar63._0_8_ = 0x8000000080000000;
        auVar63._12_4_ = 0x80000000;
        auVar63._16_4_ = 0x80000000;
        auVar63._20_4_ = 0x80000000;
        auVar63._24_4_ = 0x80000000;
        auVar63._28_4_ = 0x80000000;
        auVar2 = vfmadd213ps_fma(auVar16,local_2220,auVar15 ^ auVar63);
        local_2328 = local_24b0;
        local_2540._0_8_ = auVar2._0_8_;
        local_2360 = local_2540._0_8_;
        local_2540._8_8_ = auVar2._8_8_;
        uStack_2358 = local_2540._8_8_;
        uStack_2350 = 0;
        uStack_2348 = 0;
        *local_24b0 = ZEXT1632(auVar2);
        local_24b0 = local_24b0 + 1;
        local_2540 = ZEXT1632(auVar2);
        local_21a0 = local_2020._0_8_;
        uStack_2198 = local_2020._8_8_;
        uStack_2190 = auStack_2010._0_8_;
        uStack_2188 = auStack_2010._8_8_;
        local_20e0 = local_1f20._0_8_;
        uStack_20d8 = local_1f20._8_8_;
        uStack_20d0 = auStack_1f10._0_8_;
        uStack_20c8 = auStack_1f10._8_8_;
        local_20c0 = uVar8;
        uStack_20b8 = uVar9;
        uStack_20b0 = uVar10;
        uStack_20a8 = uStack_23a8;
        local_1ffc = local_2000;
        local_1ff8 = local_2000;
        local_1ff4 = local_2000;
        local_1ff0 = local_2000;
        local_1fec = local_2000;
        local_1fe8 = local_2000;
        local_1fe4 = local_2000;
        local_1f40 = in_stack_ffffffffffffd994;
        local_1f3c = in_stack_ffffffffffffd994;
        local_1f38 = in_stack_ffffffffffffd994;
        local_1f34 = in_stack_ffffffffffffd994;
        local_1f30 = in_stack_ffffffffffffd994;
        local_1f2c = in_stack_ffffffffffffd994;
        local_1f28 = in_stack_ffffffffffffd994;
        local_1f24 = in_stack_ffffffffffffd994;
        local_1efc = local_1f00;
        local_1ef8 = local_1f00;
        local_1ef4 = local_1f00;
        local_1ef0 = local_1f00;
        local_1eec = local_1f00;
        local_1ee8 = local_1f00;
        local_1ee4 = local_1f00;
        local_1e00 = local_1e80;
        fStack_1dfc = fStack_1e7c;
        fStack_1df8 = fStack_1e78;
        fStack_1df4 = fStack_1e74;
        fStack_1df0 = fStack_1e70;
        fStack_1dec = fStack_1e6c;
        fStack_1de8 = fStack_1e68;
        fStack_1de4 = fStack_1e64;
        _local_1720 = auVar5;
        local_16e0 = local_1760._0_8_;
        uStack_16d8 = local_1760._8_8_;
        uStack_16d0 = local_1760._16_8_;
        uStack_16c8 = local_1760._24_8_;
        local_1500 = local_1520;
        uStack_14f8 = uStack_1518;
        uStack_14f0 = uStack_1510;
        uStack_14e8 = uStack_1508;
        local_1480 = local_1740;
        uStack_1478 = uStack_1738;
        uStack_1470 = uStack_1730;
        uStack_1468 = uStack_1728;
        local_1440 = uVar11;
        uStack_1438 = uVar12;
        uStack_1430 = uVar13;
        uStack_1428 = uVar14;
        local_fc0 = local_1020;
      }
    }
  }
  else if (local_24a4 == 4) {
    local_24a4 = 4;
    for (local_2544 = 0; local_2544 < local_249c; local_2544 = local_2544 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd994,in_stack_ffffffffffffd990),
                         (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
      in_stack_ffffffffffffd988 =
           (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_2598);
      ncnn::Mat::~Mat((Mat *)0x51ce0d);
      local_2550 = in_stack_ffffffffffffd988;
      for (local_259c = 0; local_259c < local_24a0; local_259c = local_259c + 1) {
        local_2318 = local_2550;
        local_22c0 = *(undefined8 *)*local_2550;
        uStack_22b8 = *(undefined8 *)(*local_2550 + 8);
        local_b54 = 0x3f800000;
        local_b70 = 0x3f800000;
        local_22d0 = 0x3f8000003f800000;
        uStack_22c8 = 0x3f8000003f800000;
        local_b74 = 0x40000000;
        local_b90 = 0x40000000;
        local_22e0 = 0x4000000040000000;
        uStack_22d8 = 0x4000000040000000;
        local_aa0._0_4_ = (float)local_22c0;
        local_aa0._4_4_ = (float)((ulong)local_22c0 >> 0x20);
        uStack_a98._0_4_ = (float)uStack_22b8;
        uStack_a98._4_4_ = (float)((ulong)uStack_22b8 >> 0x20);
        local_a40 = (float)local_aa0 * 2.0;
        fStack_a3c = local_aa0._4_4_ * 2.0;
        fStack_a38 = (float)uStack_a98 * 2.0;
        fStack_a34 = uStack_a98._4_4_ * 2.0;
        local_a14 = 0x3f800000;
        local_a30 = 0x3f800000;
        local_a50 = 0x3f8000003f800000;
        uStack_a48 = 0x3f8000003f800000;
        local_960._8_8_ = 0x3f8000003f800000;
        local_960._0_8_ = 0x3f8000003f800000;
        local_270 = ZEXT816(0) << 0x20;
        local_a00 = 0;
        local_240._8_8_ = SUB168(ZEXT816(0),4);
        uStack_9f8 = local_240._8_8_;
        local_a10 = CONCAT44(fStack_a3c,local_a40);
        uStack_a08 = CONCAT44(fStack_a34,fStack_a38);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_240._8_8_;
        auVar38._8_8_ = uStack_a08;
        auVar38._0_8_ = local_a10;
        auVar2 = vsubps_avx(auVar59 << 0x40,auVar38);
        local_580 = 0x3f800000;
        uStack_57c = 0x3f800000;
        uStack_578 = 0x3f800000;
        uStack_574 = 0x3f800000;
        local_540._0_8_ = auVar2._0_8_;
        local_220 = local_540._0_8_;
        local_540._8_8_ = auVar2._8_8_;
        uStack_218 = local_540._8_8_;
        local_230 = 0x42b0c0a5;
        uStack_22c = 0x42b0c0a5;
        uStack_228 = 0x42b0c0a5;
        uStack_224 = 0x42b0c0a5;
        auVar44._8_4_ = 0x42b0c0a5;
        auVar44._0_8_ = 0x42b0c0a542b0c0a5;
        auVar44._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar44);
        local_540._0_8_ = auVar2._0_8_;
        local_1e0 = local_540._0_8_;
        local_540._8_8_ = auVar2._8_8_;
        uStack_1d8 = local_540._8_8_;
        local_1f0 = 0xc2b0c0a5;
        uStack_1ec = 0xc2b0c0a5;
        uStack_1e8 = 0xc2b0c0a5;
        uStack_1e4 = 0xc2b0c0a5;
        auVar46._8_4_ = 0xc2b0c0a5;
        auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar46._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar46);
        local_540._0_8_ = auVar3._0_8_;
        uVar8 = local_540._0_8_;
        local_540._8_8_ = auVar3._8_8_;
        uVar9 = local_540._8_8_;
        local_390 = 0x3fb8aa3b;
        uStack_38c = 0x3fb8aa3b;
        uStack_388 = 0x3fb8aa3b;
        uStack_384 = 0x3fb8aa3b;
        local_380._0_4_ = auVar3._0_4_;
        local_380._4_4_ = auVar3._4_4_;
        uStack_378._0_4_ = auVar3._8_4_;
        uStack_378._4_4_ = auVar3._12_4_;
        local_560._4_4_ = local_380._4_4_ * 1.442695;
        local_560._0_4_ = (float)local_380 * 1.442695;
        uStack_558._0_4_ = (float)uStack_378 * 1.442695;
        uStack_558._4_4_ = uStack_378._4_4_ * 1.442695;
        local_280 = local_560;
        uStack_278 = uStack_558;
        local_290 = 0x3f000000;
        uStack_28c = 0x3f000000;
        uStack_288 = 0x3f000000;
        uStack_284 = 0x3f000000;
        local_560._0_4_ = (float)local_380 * 1.442695 + 0.5;
        local_560._4_4_ = local_380._4_4_ * 1.442695 + 0.5;
        fVar65 = (float)uStack_378 * 1.442695 + 0.5;
        fVar66 = uStack_378._4_4_ * 1.442695 + 0.5;
        uStack_558._0_4_ = fVar65;
        uStack_558._4_4_ = fVar66;
        local_1a0 = local_560;
        uStack_198 = uStack_558;
        local_570._4_4_ = (int)(float)local_560._4_4_;
        local_570._0_4_ = (int)(float)local_560._0_4_;
        local_570._8_4_ = (int)fVar65;
        local_570._12_4_ = (int)fVar66;
        local_170 = local_570._0_8_;
        uStack_168 = local_570._8_8_;
        auVar48._8_8_ = local_570._8_8_;
        auVar48._0_8_ = local_570._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar48);
        local_550 = auVar1._0_8_;
        local_140 = local_550;
        uStack_548 = auVar1._8_8_;
        uStack_138 = uStack_548;
        local_150 = local_560;
        uStack_148 = uStack_558;
        auVar50._8_8_ = uStack_558;
        auVar50._0_8_ = local_560;
        auVar2 = vcmpps_avx(auVar50,auVar1,1);
        local_590._0_8_ = auVar2._0_8_;
        local_100 = local_590._0_8_;
        local_590._8_8_ = auVar2._8_8_;
        uStack_f8 = local_590._8_8_;
        local_110 = 0x3f8000003f800000;
        uStack_108 = 0x3f8000003f800000;
        auVar52._8_8_ = 0x3f8000003f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        local_590 = vpand_avx(auVar2,auVar52);
        local_4e0 = local_550;
        uStack_4d8 = uStack_548;
        local_4f0 = local_590._0_8_;
        uStack_4e8 = local_590._8_8_;
        _local_560 = vsubps_avx(auVar1,local_590);
        local_3b0 = 0x3f318000;
        uStack_3ac = 0x3f318000;
        uStack_3a8 = 0x3f318000;
        uStack_3a4 = 0x3f318000;
        local_3a0._0_4_ = local_560._0_4_;
        local_3a0._4_4_ = local_560._4_4_;
        uStack_398._0_4_ = local_560._8_4_;
        uStack_398._4_4_ = local_560._12_4_;
        local_550 = CONCAT44(local_3a0._4_4_ * 0.6933594,(float)local_3a0 * 0.6933594);
        uStack_548._0_4_ = (float)uStack_398 * 0.6933594;
        uStack_548._4_4_ = uStack_398._4_4_ * 0.6933594;
        local_3c0 = local_560;
        uStack_3b8 = uStack_558;
        local_3d0 = 0xb95e8083;
        uStack_3cc = 0xb95e8083;
        uStack_3c8 = 0xb95e8083;
        uStack_3c4 = 0xb95e8083;
        local_500 = local_540._0_8_;
        uStack_4f8 = local_540._8_8_;
        local_510 = local_550;
        uStack_508 = uStack_548;
        auVar43._8_8_ = uStack_548;
        auVar43._0_8_ = local_550;
        auVar2 = vsubps_avx(auVar3,auVar43);
        local_540._0_8_ = auVar2._0_8_;
        local_520 = local_540._0_8_;
        local_540._8_8_ = auVar2._8_8_;
        uStack_518 = local_540._8_8_;
        local_530 = CONCAT44(local_3a0._4_4_ * -0.00021219444,(float)local_3a0 * -0.00021219444);
        uStack_528 = CONCAT44(uStack_398._4_4_ * -0.00021219444,(float)uStack_398 * -0.00021219444);
        auVar42._8_8_ = uStack_528;
        auVar42._0_8_ = local_530;
        local_540 = vsubps_avx(auVar2,auVar42);
        local_3f0 = local_540._0_8_;
        uStack_3e8 = local_540._8_8_;
        local_3e0._0_4_ = local_540._0_4_;
        local_3e0._4_4_ = local_540._4_4_;
        uStack_3d8._0_4_ = local_540._8_4_;
        uStack_3d8._4_4_ = local_540._12_4_;
        local_5a0 = (float)local_3e0 * (float)local_3e0;
        fStack_59c = local_3e0._4_4_ * local_3e0._4_4_;
        fStack_598 = (float)uStack_3d8 * (float)uStack_3d8;
        fStack_594 = uStack_3d8._4_4_ * uStack_3d8._4_4_;
        local_400 = 0x3950696739506967;
        uStack_3f8 = 0x3950696739506967;
        local_410 = local_540._0_8_;
        uStack_408 = local_540._8_8_;
        local_2a0 = CONCAT44(local_3e0._4_4_ * 0.00019875691,(float)local_3e0 * 0.00019875691);
        uStack_298 = CONCAT44(uStack_3d8._4_4_ * 0.00019875691,(float)uStack_3d8 * 0.00019875691);
        local_2b0 = 0x3ab743ce;
        uStack_2ac = 0x3ab743ce;
        uStack_2a8 = 0x3ab743ce;
        uStack_2a4 = 0x3ab743ce;
        local_5b0 = (float)local_3e0 * 0.00019875691 + 0.0013981999;
        fStack_5ac = local_3e0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_5a8 = (float)uStack_3d8 * 0.00019875691 + 0.0013981999;
        fStack_5a4 = uStack_3d8._4_4_ * 0.00019875691 + 0.0013981999;
        local_420 = CONCAT44(fStack_5ac,local_5b0);
        uStack_418 = CONCAT44(fStack_5a4,fStack_5a8);
        local_430 = local_540._0_8_;
        uStack_428 = local_540._8_8_;
        local_5b0 = local_5b0 * (float)local_3e0;
        fStack_5ac = fStack_5ac * local_3e0._4_4_;
        fStack_5a8 = fStack_5a8 * (float)uStack_3d8;
        fStack_5a4 = fStack_5a4 * uStack_3d8._4_4_;
        local_2c0 = CONCAT44(fStack_5ac,local_5b0);
        uStack_2b8 = CONCAT44(fStack_5a4,fStack_5a8);
        local_2d0 = 0x3c088908;
        uStack_2cc = 0x3c088908;
        uStack_2c8 = 0x3c088908;
        uStack_2c4 = 0x3c088908;
        local_5b0 = local_5b0 + 0.008333452;
        fStack_5ac = fStack_5ac + 0.008333452;
        fStack_5a8 = fStack_5a8 + 0.008333452;
        fStack_5a4 = fStack_5a4 + 0.008333452;
        local_440 = CONCAT44(fStack_5ac,local_5b0);
        uStack_438 = CONCAT44(fStack_5a4,fStack_5a8);
        local_450 = local_540._0_8_;
        uStack_448 = local_540._8_8_;
        local_5b0 = local_5b0 * (float)local_3e0;
        fStack_5ac = fStack_5ac * local_3e0._4_4_;
        fStack_5a8 = fStack_5a8 * (float)uStack_3d8;
        fStack_5a4 = fStack_5a4 * uStack_3d8._4_4_;
        local_2e0 = CONCAT44(fStack_5ac,local_5b0);
        uStack_2d8 = CONCAT44(fStack_5a4,fStack_5a8);
        local_2f0 = 0x3d2aa9c1;
        uStack_2ec = 0x3d2aa9c1;
        uStack_2e8 = 0x3d2aa9c1;
        uStack_2e4 = 0x3d2aa9c1;
        local_5b0 = local_5b0 + 0.041665796;
        fStack_5ac = fStack_5ac + 0.041665796;
        fStack_5a8 = fStack_5a8 + 0.041665796;
        fStack_5a4 = fStack_5a4 + 0.041665796;
        local_460 = CONCAT44(fStack_5ac,local_5b0);
        uStack_458 = CONCAT44(fStack_5a4,fStack_5a8);
        local_470 = local_540._0_8_;
        uStack_468 = local_540._8_8_;
        local_5b0 = local_5b0 * (float)local_3e0;
        fStack_5ac = fStack_5ac * local_3e0._4_4_;
        fStack_5a8 = fStack_5a8 * (float)uStack_3d8;
        fStack_5a4 = fStack_5a4 * uStack_3d8._4_4_;
        local_300 = CONCAT44(fStack_5ac,local_5b0);
        uStack_2f8 = CONCAT44(fStack_5a4,fStack_5a8);
        local_310 = 0x3e2aaaaa;
        uStack_30c = 0x3e2aaaaa;
        uStack_308 = 0x3e2aaaaa;
        uStack_304 = 0x3e2aaaaa;
        local_5b0 = local_5b0 + 0.16666666;
        fStack_5ac = fStack_5ac + 0.16666666;
        fStack_5a8 = fStack_5a8 + 0.16666666;
        fStack_5a4 = fStack_5a4 + 0.16666666;
        local_480 = CONCAT44(fStack_5ac,local_5b0);
        uStack_478 = CONCAT44(fStack_5a4,fStack_5a8);
        local_490 = local_540._0_8_;
        uStack_488 = local_540._8_8_;
        local_5b0 = local_5b0 * (float)local_3e0;
        fStack_5ac = fStack_5ac * local_3e0._4_4_;
        fStack_5a8 = fStack_5a8 * (float)uStack_3d8;
        fStack_5a4 = fStack_5a4 * uStack_3d8._4_4_;
        local_320 = CONCAT44(fStack_5ac,local_5b0);
        uStack_318 = CONCAT44(fStack_5a4,fStack_5a8);
        local_330 = 0x3f000000;
        uStack_32c = 0x3f000000;
        uStack_328 = 0x3f000000;
        uStack_324 = 0x3f000000;
        local_5b0 = local_5b0 + 0.5;
        fStack_5ac = fStack_5ac + 0.5;
        fStack_5a8 = fStack_5a8 + 0.5;
        fStack_5a4 = fStack_5a4 + 0.5;
        local_4a0 = CONCAT44(fStack_5ac,local_5b0);
        uStack_498 = CONCAT44(fStack_5a4,fStack_5a8);
        local_4b0 = CONCAT44(fStack_59c,local_5a0);
        uStack_4a8 = CONCAT44(fStack_594,fStack_598);
        local_5b0 = local_5b0 * local_5a0;
        fStack_5ac = fStack_5ac * fStack_59c;
        fStack_5a8 = fStack_5a8 * fStack_598;
        fStack_5a4 = fStack_5a4 * fStack_594;
        local_340 = CONCAT44(fStack_5ac,local_5b0);
        uStack_338 = CONCAT44(fStack_5a4,fStack_5a8);
        local_350 = local_540._0_8_;
        uStack_348 = local_540._8_8_;
        local_5b0 = local_5b0 + (float)local_3e0;
        fStack_5ac = fStack_5ac + local_3e0._4_4_;
        fStack_5a8 = fStack_5a8 + (float)uStack_3d8;
        fStack_5a4 = fStack_5a4 + uStack_3d8._4_4_;
        local_360 = CONCAT44(fStack_5ac,local_5b0);
        uStack_358 = CONCAT44(fStack_5a4,fStack_5a8);
        local_370 = 0x3f8000003f800000;
        uStack_368 = 0x3f8000003f800000;
        local_5b0 = local_5b0 + 1.0;
        fStack_5ac = fStack_5ac + 1.0;
        fStack_5a8 = fStack_5a8 + 1.0;
        fStack_5a4 = fStack_5a4 + 1.0;
        local_1b0 = local_560;
        uStack_1a8 = uStack_558;
        local_570._4_4_ = (int)local_3a0._4_4_;
        local_570._0_4_ = (int)(float)local_3a0;
        local_570._8_4_ = (int)(float)uStack_398;
        local_570._12_4_ = (int)uStack_398._4_4_;
        local_c0 = local_570._0_8_;
        uStack_b8 = local_570._8_8_;
        local_d0 = 0x7f0000007f;
        uStack_c8 = 0x7f0000007f;
        auVar55._8_8_ = local_570._8_8_;
        auVar55._0_8_ = local_570._0_8_;
        auVar54._8_8_ = 0x7f0000007f;
        auVar54._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar55,auVar54);
        local_570._0_8_ = auVar2._0_8_;
        local_80 = local_570._0_8_;
        local_570._8_8_ = auVar2._8_8_;
        uStack_78 = local_570._8_8_;
        local_84 = 0x17;
        local_570 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_570._0_8_;
        uStack_48 = local_570._8_8_;
        local_5c0 = local_570._0_8_;
        uStack_5b8 = local_570._8_8_;
        local_4c0._4_4_ = fStack_5ac;
        local_4c0._0_4_ = local_5b0;
        local_4c0._8_4_ = fStack_5a8;
        local_4c0._12_4_ = fStack_5a4;
        local_4d0._0_4_ = local_570._0_4_;
        local_4d0._4_4_ = local_570._4_4_;
        uStack_4c8._0_4_ = local_570._8_4_;
        uStack_4c8._4_4_ = local_570._12_4_;
        local_5b0 = local_5b0 * (float)local_4d0;
        fStack_5ac = fStack_5ac * local_4d0._4_4_;
        fStack_5a8 = fStack_5a8 * (float)uStack_4c8;
        fStack_5a4 = fStack_5a4 * uStack_4c8._4_4_;
        local_930 = CONCAT44(fStack_5ac,local_5b0);
        uStack_928 = CONCAT44(fStack_5a4,fStack_5a8);
        local_970 = local_5b0 + 1.0;
        fStack_96c = fStack_5ac + 1.0;
        fStack_968 = fStack_5a8 + 1.0;
        fStack_964 = fStack_5a4 + 1.0;
        auVar39._4_4_ = fStack_96c;
        auVar39._0_4_ = local_970;
        auVar39._8_4_ = fStack_968;
        auVar39._12_4_ = fStack_964;
        _local_ac0 = vdivps_avx(local_960,auVar39);
        local_b00._0_4_ = (float)local_ac0._0_4_ * 2.0;
        local_b00._4_4_ = (float)local_ac0._4_4_ * 2.0;
        local_b00._8_4_ = fStack_ab8 * 2.0;
        local_b00._12_4_ = fStack_ab4 * 2.0;
        auVar37._8_8_ = 0x3f8000003f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        local_25b0 = vsubps_avx(local_b00,auVar37);
        local_2278 = local_2550;
        local_2290 = local_25b0._0_8_;
        uStack_2288 = local_25b0._8_8_;
        *local_2550 = local_25b0;
        local_2550 = local_2550 + 1;
        uStack_b8c = local_b90;
        uStack_b88 = local_b90;
        uStack_b84 = local_b90;
        uStack_b6c = local_b70;
        uStack_b68 = local_b70;
        uStack_b64 = local_b70;
        local_b10 = local_22d0;
        uStack_b08 = uStack_22c8;
        local_ad0 = local_22e0;
        uStack_ac8 = uStack_22d8;
        local_ab0 = local_22e0;
        uStack_aa8 = uStack_22d8;
        local_aa0 = local_22c0;
        uStack_a98 = uStack_22b8;
        uStack_a2c = local_a30;
        uStack_a28 = local_a30;
        uStack_a24 = local_a30;
        local_920 = local_960;
        local_4d0 = local_570._0_8_;
        uStack_4c8 = local_570._8_8_;
        local_3e0 = local_3f0;
        uStack_3d8 = uStack_3e8;
        local_3a0 = local_560;
        uStack_398 = uStack_558;
        local_380 = uVar8;
        uStack_378 = uVar9;
        local_240 = local_270;
      }
    }
  }
  else {
    for (local_25b4 = 0; local_25b4 < local_249c; local_25b4 = local_25b4 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd994,in_stack_ffffffffffffd990),
                         (int)((ulong)in_stack_ffffffffffffd988 >> 0x20));
      pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2608);
      ncnn::Mat::~Mat((Mat *)0x51d96c);
      local_25c0 = pauVar61;
      for (local_260c = 0; local_260c + 7 < local_24a0; local_260c = local_260c + 8) {
        local_2470 = local_25c0;
        auVar58 = *(undefined1 (*) [24])*local_25c0;
        uStack_2408 = *(undefined8 *)(*local_25c0 + 0x18);
        local_2640 = auVar58._0_8_;
        local_2420 = local_2640;
        uStack_2638 = auVar58._8_8_;
        uStack_2418 = uStack_2638;
        uStack_2630 = auVar58._16_8_;
        uStack_2410 = uStack_2630;
        local_2264 = 0x3f800000;
        local_1fc0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_1fe0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1fd0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2440 = local_1fe0._0_8_;
        uStack_2438 = local_1fe0._8_8_;
        uStack_2430 = auStack_1fd0._0_8_;
        uStack_2428 = auStack_1fd0._8_8_;
        local_2268 = 0x40000000;
        local_1f80 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_1fa0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_1f90 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_2460 = local_1fa0._0_8_;
        uStack_2458 = local_1fa0._8_8_;
        uStack_2450 = auStack_1f90._0_8_;
        uStack_2448 = auStack_1f90._8_8_;
        uVar8 = local_2640;
        uVar9 = uStack_2638;
        local_2080._0_4_ = auVar58._0_4_;
        local_2080._4_4_ = auVar58._4_4_;
        uStack_2078._0_4_ = auVar58._8_4_;
        uStack_2078._4_4_ = auVar58._12_4_;
        uStack_2070._0_4_ = auVar58._16_4_;
        uStack_2070._4_4_ = auVar58._20_4_;
        uStack_2068._0_4_ = (float)uStack_2408;
        uStack_2068._4_4_ = (undefined4)((ulong)uStack_2408 >> 0x20);
        uStack_2104 = uStack_2068._4_4_;
        local_20a0._0_4_ = local_1fa0._0_4_;
        local_20a0._4_4_ = local_1fa0._4_4_;
        uStack_2098._0_4_ = local_1fa0._8_4_;
        uStack_2098._4_4_ = local_1fa0._12_4_;
        uStack_2090._0_4_ = auStack_1f90._0_4_;
        uStack_2090._4_4_ = auStack_1f90._4_4_;
        uStack_2088._0_4_ = auStack_1f90._8_4_;
        local_2120 = (float)local_2080 * (float)local_20a0;
        fStack_211c = local_2080._4_4_ * local_20a0._4_4_;
        fStack_2118 = (float)uStack_2078 * (float)uStack_2098;
        fStack_2114 = uStack_2078._4_4_ * uStack_2098._4_4_;
        fStack_2110 = (float)uStack_2070 * (float)uStack_2090;
        fStack_210c = uStack_2070._4_4_ * uStack_2090._4_4_;
        fStack_2108 = (float)uStack_2068 * (float)uStack_2088;
        local_20e4 = 0x3f800000;
        local_2040 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2060 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2050 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2140._0_4_ = local_2060._0_4_;
        local_1ec0 = (float)local_2140;
        local_2140._4_4_ = local_2060._4_4_;
        fStack_1ebc = local_2140._4_4_;
        uStack_2138._0_4_ = local_2060._8_4_;
        fStack_1eb8 = (float)uStack_2138;
        uStack_2138._4_4_ = local_2060._12_4_;
        fStack_1eb4 = uStack_2138._4_4_;
        uStack_2130._0_4_ = auStack_2050._0_4_;
        fStack_1eb0 = (float)uStack_2130;
        uStack_2130._4_4_ = auStack_2050._4_4_;
        fStack_1eac = uStack_2130._4_4_;
        uStack_2128._0_4_ = auStack_2050._8_4_;
        fStack_1ea8 = (float)uStack_2128;
        uStack_2128._4_4_ = auStack_2050._12_4_;
        fStack_1ea4 = uStack_2128._4_4_;
        local_1000 = ZEXT832(0) << 0x20;
        local_1080 = 0;
        local_fe0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1078 = local_fe0._8_8_;
        uStack_1070 = 0;
        uStack_1068 = 0;
        local_10a0 = CONCAT44(fStack_211c,local_2120);
        uStack_1098 = CONCAT44(fStack_2114,fStack_2118);
        uStack_1090 = CONCAT44(fStack_210c,fStack_2110);
        uStack_1088 = CONCAT44(uStack_2068._4_4_,fStack_2108);
        auVar25._8_8_ = uStack_1098;
        auVar25._0_8_ = local_10a0;
        auVar25._16_8_ = uStack_1090;
        auVar25._24_8_ = uStack_1088;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_fe0._8_8_) << 0x40,auVar25);
        local_1d60 = 0x3f800000;
        uStack_1d5c = 0x3f800000;
        uStack_1d58 = 0x3f800000;
        uStack_1d54 = 0x3f800000;
        uStack_1d50 = 0x3f800000;
        uStack_1d4c = 0x3f800000;
        uStack_1d48 = 0x3f800000;
        uStack_1d44 = 0x3f800000;
        local_1ce0._0_8_ = auVar6._0_8_;
        local_f40 = local_1ce0._0_8_;
        local_1ce0._8_8_ = auVar6._8_8_;
        uStack_f38 = local_1ce0._8_8_;
        local_1ce0._16_8_ = auVar6._16_8_;
        uStack_f30 = local_1ce0._16_8_;
        local_1ce0._24_8_ = auVar6._24_8_;
        uStack_f28 = local_1ce0._24_8_;
        local_f60 = 0x42b0c0a5;
        uStack_f5c = 0x42b0c0a5;
        uStack_f58 = 0x42b0c0a5;
        uStack_f54 = 0x42b0c0a5;
        uStack_f50 = 0x42b0c0a5;
        uStack_f4c = 0x42b0c0a5;
        uStack_f48 = 0x42b0c0a5;
        uStack_f44 = 0x42b0c0a5;
        auVar28._8_4_ = 0x42b0c0a5;
        auVar28._0_8_ = 0x42b0c0a542b0c0a5;
        auVar28._12_4_ = 0x42b0c0a5;
        auVar28._16_4_ = 0x42b0c0a5;
        auVar28._20_4_ = 0x42b0c0a5;
        auVar28._24_4_ = 0x42b0c0a5;
        auVar28._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar28);
        local_1ce0._0_8_ = auVar6._0_8_;
        local_ec0 = local_1ce0._0_8_;
        local_1ce0._8_8_ = auVar6._8_8_;
        uStack_eb8 = local_1ce0._8_8_;
        local_1ce0._16_8_ = auVar6._16_8_;
        uStack_eb0 = local_1ce0._16_8_;
        local_1ce0._24_8_ = auVar6._24_8_;
        uStack_ea8 = local_1ce0._24_8_;
        local_ee0 = 0xc2b0c0a5;
        uStack_edc = 0xc2b0c0a5;
        uStack_ed8 = 0xc2b0c0a5;
        uStack_ed4 = 0xc2b0c0a5;
        uStack_ed0 = 0xc2b0c0a5;
        uStack_ecc = 0xc2b0c0a5;
        uStack_ec8 = 0xc2b0c0a5;
        uStack_ec4 = 0xc2b0c0a5;
        auVar30._8_4_ = 0xc2b0c0a5;
        auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30._12_4_ = 0xc2b0c0a5;
        auVar30._16_4_ = 0xc2b0c0a5;
        auVar30._20_4_ = 0xc2b0c0a5;
        auVar30._24_4_ = 0xc2b0c0a5;
        auVar30._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar30);
        local_1ce0._0_8_ = auVar4._0_8_;
        uVar10 = local_1ce0._0_8_;
        local_1ce0._8_8_ = auVar4._8_8_;
        uVar11 = local_1ce0._8_8_;
        local_1ce0._16_8_ = auVar4._16_8_;
        uVar12 = local_1ce0._16_8_;
        local_1ce0._24_8_ = auVar4._24_8_;
        uVar13 = local_1ce0._24_8_;
        local_1a40 = 0x3fb8aa3b;
        uStack_1a3c = 0x3fb8aa3b;
        uStack_1a38 = 0x3fb8aa3b;
        uStack_1a34 = 0x3fb8aa3b;
        uStack_1a30 = 0x3fb8aa3b;
        uStack_1a2c = 0x3fb8aa3b;
        uStack_1a28 = 0x3fb8aa3b;
        uStack_1a24 = 0x3fb8aa3b;
        local_1a20._0_4_ = auVar4._0_4_;
        local_1a20._4_4_ = auVar4._4_4_;
        uStack_1a18._0_4_ = auVar4._8_4_;
        uStack_1a18._4_4_ = auVar4._12_4_;
        uStack_1a10._0_4_ = auVar4._16_4_;
        uStack_1a10._4_4_ = auVar4._20_4_;
        uStack_1a08._0_4_ = auVar4._24_4_;
        uStack_1a08._4_4_ = auVar4._28_4_;
        local_1d20._4_4_ = local_1a20._4_4_ * 1.442695;
        local_1d20._0_4_ = (float)local_1a20 * 1.442695;
        uStack_1d18._0_4_ = (float)uStack_1a18 * 1.442695;
        uStack_1d18._4_4_ = uStack_1a18._4_4_ * 1.442695;
        uStack_1d10._0_4_ = (float)uStack_1a10 * 1.442695;
        uStack_1d10._4_4_ = uStack_1a10._4_4_ * 1.442695;
        auVar58 = _local_1d20;
        uStack_1d08._0_4_ = (float)uStack_1a08 * 1.442695;
        uStack_1d08._4_4_ = uStack_1a08._4_4_;
        auVar6 = _local_1d20;
        local_1820 = local_1d20;
        uStack_1818 = uStack_1d18;
        uStack_1d10 = auVar58._16_8_;
        uStack_1810 = uStack_1d10;
        uStack_1d08 = auVar6._24_8_;
        uStack_1808 = uStack_1d08;
        local_1840 = 0x3f000000;
        uStack_183c = 0x3f000000;
        uStack_1838 = 0x3f000000;
        uStack_1834 = 0x3f000000;
        uStack_1830 = 0x3f000000;
        uStack_182c = 0x3f000000;
        uStack_1828 = 0x3f000000;
        uStack_1824 = 0x3f000000;
        local_1d20._4_4_ = local_1a20._4_4_ * 1.442695 + 0.5;
        local_1d20._0_4_ = (float)local_1a20 * 1.442695 + 0.5;
        uStack_1d18._0_4_ = (float)uStack_1a18 * 1.442695 + 0.5;
        uStack_1d18._4_4_ = uStack_1a18._4_4_ * 1.442695 + 0.5;
        uStack_1d10._0_4_ = (float)uStack_1a10 * 1.442695 + 0.5;
        uStack_1d10._4_4_ = uStack_1a10._4_4_ * 1.442695 + 0.5;
        uStack_1d08._0_4_ = (float)uStack_1a08 * 1.442695 + 0.5;
        uStack_1d08._4_4_ = uStack_1a08._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1d20,1);
        auVar6 = vcmpps_avx(_local_1d20,auVar5,1);
        local_1d80._0_8_ = auVar6._0_8_;
        local_e40 = local_1d80._0_8_;
        local_1d80._8_8_ = auVar6._8_8_;
        uStack_e38 = local_1d80._8_8_;
        local_1d80._16_8_ = auVar6._16_8_;
        uStack_e30 = local_1d80._16_8_;
        local_1d80._24_8_ = auVar6._24_8_;
        uStack_e28 = local_1d80._24_8_;
        local_e60 = 0x3f8000003f800000;
        uStack_e58 = 0x3f8000003f800000;
        uStack_e50 = 0x3f8000003f800000;
        uStack_e48 = 0x3f8000003f800000;
        auVar32._8_8_ = 0x3f8000003f800000;
        auVar32._0_8_ = 0x3f8000003f800000;
        auVar32._16_8_ = 0x3f8000003f800000;
        auVar32._24_8_ = 0x3f8000003f800000;
        local_1d80 = vpand_avx2(auVar6,auVar32);
        local_1d00 = auVar5._0_8_;
        local_10c0 = local_1d00;
        uStack_1cf8 = auVar5._8_8_;
        uStack_10b8 = uStack_1cf8;
        uStack_1cf0 = auVar5._16_8_;
        uStack_10b0 = uStack_1cf0;
        uStack_1ce8 = auVar5._24_8_;
        uStack_10a8 = uStack_1ce8;
        local_10e0 = local_1d80._0_8_;
        uStack_10d8 = local_1d80._8_8_;
        uStack_10d0 = local_1d80._16_8_;
        uStack_10c8 = local_1d80._24_8_;
        _local_1d20 = vsubps_avx(auVar5,local_1d80);
        local_1a80 = 0x3f318000;
        uStack_1a7c = 0x3f318000;
        uStack_1a78 = 0x3f318000;
        uStack_1a74 = 0x3f318000;
        uStack_1a70 = 0x3f318000;
        uStack_1a6c = 0x3f318000;
        uStack_1a68 = 0x3f318000;
        uStack_1a64 = 0x3f318000;
        local_1a60._0_4_ = local_1d20._0_4_;
        local_1a60._4_4_ = local_1d20._4_4_;
        uStack_1a58._0_4_ = local_1d20._8_4_;
        uStack_1a58._4_4_ = local_1d20._12_4_;
        uStack_1a50._0_4_ = local_1d20._16_4_;
        uStack_1a50._4_4_ = local_1d20._20_4_;
        uStack_1a48._0_4_ = local_1d20._24_4_;
        uStack_1a48._4_4_ = local_1d20._28_4_;
        local_1d00._4_4_ = local_1a60._4_4_ * 0.6933594;
        local_1d00._0_4_ = (float)local_1a60 * 0.6933594;
        uStack_1cf8._0_4_ = (float)uStack_1a58 * 0.6933594;
        uStack_1cf8._4_4_ = uStack_1a58._4_4_ * 0.6933594;
        uStack_1cf0._0_4_ = (float)uStack_1a50 * 0.6933594;
        uStack_1cf0._4_4_ = uStack_1a50._4_4_ * 0.6933594;
        auVar58 = _local_1d00;
        uStack_1ce8._0_4_ = (float)uStack_1a48 * 0.6933594;
        uStack_1ce8._4_4_ = uStack_1a48._4_4_;
        auVar25 = _local_1d00;
        local_1aa0 = local_1d20;
        uStack_1a98 = uStack_1d18;
        uStack_1a90 = uStack_1d10;
        uStack_1a88 = uStack_1d08;
        local_1ac0 = 0xb95e8083;
        uStack_1abc = 0xb95e8083;
        uStack_1ab8 = 0xb95e8083;
        uStack_1ab4 = 0xb95e8083;
        uStack_1ab0 = 0xb95e8083;
        uStack_1aac = 0xb95e8083;
        uStack_1aa8 = 0xb95e8083;
        uStack_1aa4 = 0xb95e8083;
        local_1100 = local_1ce0._0_8_;
        uStack_10f8 = local_1ce0._8_8_;
        uStack_10f0 = local_1ce0._16_8_;
        uStack_10e8 = local_1ce0._24_8_;
        local_1120 = local_1d00;
        uStack_1118 = uStack_1cf8;
        uStack_1cf0 = auVar58._16_8_;
        uStack_1110 = uStack_1cf0;
        uStack_1ce8 = auVar25._24_8_;
        uStack_1108 = uStack_1ce8;
        auVar24._16_8_ = uStack_1cf0;
        auVar24._0_16_ = _local_1d00;
        auVar24._24_8_ = uStack_1ce8;
        auVar6 = vsubps_avx(auVar4,auVar24);
        local_1ce0._0_8_ = auVar6._0_8_;
        local_1140 = local_1ce0._0_8_;
        local_1ce0._8_8_ = auVar6._8_8_;
        uStack_1138 = local_1ce0._8_8_;
        local_1ce0._16_8_ = auVar6._16_8_;
        uStack_1130 = local_1ce0._16_8_;
        local_1ce0._24_8_ = auVar6._24_8_;
        uStack_1128 = local_1ce0._24_8_;
        local_1160 = CONCAT44(local_1a60._4_4_ * -0.00021219444,(float)local_1a60 * -0.00021219444);
        uStack_1158 = CONCAT44(uStack_1a58._4_4_ * -0.00021219444,
                               (float)uStack_1a58 * -0.00021219444);
        uStack_1150 = CONCAT44(uStack_1a50._4_4_ * -0.00021219444,
                               (float)uStack_1a50 * -0.00021219444);
        uStack_1148 = CONCAT44(uStack_1a48._4_4_,(float)uStack_1a48 * -0.00021219444);
        auVar23._8_8_ = uStack_1158;
        auVar23._0_8_ = local_1160;
        auVar23._16_8_ = uStack_1150;
        auVar23._24_8_ = uStack_1148;
        local_1ce0 = vsubps_avx(auVar6,auVar23);
        local_1b00 = local_1ce0._0_8_;
        uStack_1af8 = local_1ce0._8_8_;
        uStack_1af0 = local_1ce0._16_8_;
        uStack_1ae8 = local_1ce0._24_8_;
        local_1ae0._0_4_ = local_1ce0._0_4_;
        local_1ae0._4_4_ = local_1ce0._4_4_;
        uStack_1ad8._0_4_ = local_1ce0._8_4_;
        uStack_1ad8._4_4_ = local_1ce0._12_4_;
        uStack_1ad0._0_4_ = local_1ce0._16_4_;
        uStack_1ad0._4_4_ = local_1ce0._20_4_;
        uStack_1ac8._0_4_ = local_1ce0._24_4_;
        uStack_1ac8._4_4_ = local_1ce0._28_4_;
        fStack_1d84 = uStack_1ac8._4_4_;
        local_1da0 = (float)local_1ae0 * (float)local_1ae0;
        fStack_1d9c = local_1ae0._4_4_ * local_1ae0._4_4_;
        fStack_1d98 = (float)uStack_1ad8 * (float)uStack_1ad8;
        fStack_1d94 = uStack_1ad8._4_4_ * uStack_1ad8._4_4_;
        fStack_1d90 = (float)uStack_1ad0 * (float)uStack_1ad0;
        fStack_1d8c = uStack_1ad0._4_4_ * uStack_1ad0._4_4_;
        fStack_1d88 = (float)uStack_1ac8 * (float)uStack_1ac8;
        local_1b20 = 0x3950696739506967;
        uStack_1b18 = 0x3950696739506967;
        uStack_1b10 = 0x3950696739506967;
        uStack_1b08 = 0x3950696739506967;
        local_1b40 = local_1ce0._0_8_;
        uStack_1b38 = local_1ce0._8_8_;
        uStack_1b30 = local_1ce0._16_8_;
        uStack_1b28 = local_1ce0._24_8_;
        local_1860 = CONCAT44(local_1ae0._4_4_ * 0.00019875691,(float)local_1ae0 * 0.00019875691);
        uStack_1858 = CONCAT44(uStack_1ad8._4_4_ * 0.00019875691,(float)uStack_1ad8 * 0.00019875691)
        ;
        uStack_1850 = CONCAT44(uStack_1ad0._4_4_ * 0.00019875691,(float)uStack_1ad0 * 0.00019875691)
        ;
        uStack_1848 = CONCAT44(0x39506967,(float)uStack_1ac8 * 0.00019875691);
        local_1880 = 0x3ab743ce;
        uStack_187c = 0x3ab743ce;
        uStack_1878 = 0x3ab743ce;
        uStack_1874 = 0x3ab743ce;
        uStack_1870 = 0x3ab743ce;
        uStack_186c = 0x3ab743ce;
        uStack_1868 = 0x3ab743ce;
        uStack_1864 = 0x3ab743ce;
        local_1dc0 = (float)local_1ae0 * 0.00019875691 + 0.0013981999;
        fStack_1dbc = local_1ae0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1db8 = (float)uStack_1ad8 * 0.00019875691 + 0.0013981999;
        fStack_1db4 = uStack_1ad8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1db0 = (float)uStack_1ad0 * 0.00019875691 + 0.0013981999;
        fStack_1dac = uStack_1ad0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1da8 = (float)uStack_1ac8 * 0.00019875691 + 0.0013981999;
        local_1b60 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1b58 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1b50 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1b48 = CONCAT44(0x3ad150fb,fStack_1da8);
        local_1b80 = local_1ce0._0_8_;
        uStack_1b78 = local_1ce0._8_8_;
        uStack_1b70 = local_1ce0._16_8_;
        uStack_1b68 = local_1ce0._24_8_;
        local_1dc0 = local_1dc0 * (float)local_1ae0;
        fStack_1dbc = fStack_1dbc * local_1ae0._4_4_;
        fStack_1db8 = fStack_1db8 * (float)uStack_1ad8;
        fStack_1db4 = fStack_1db4 * uStack_1ad8._4_4_;
        fStack_1db0 = fStack_1db0 * (float)uStack_1ad0;
        fStack_1dac = fStack_1dac * uStack_1ad0._4_4_;
        fStack_1da8 = fStack_1da8 * (float)uStack_1ac8;
        local_18a0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1898 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1890 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1888 = CONCAT44(0x3ad150fb,fStack_1da8);
        local_18c0 = 0x3c088908;
        uStack_18bc = 0x3c088908;
        uStack_18b8 = 0x3c088908;
        uStack_18b4 = 0x3c088908;
        uStack_18b0 = 0x3c088908;
        uStack_18ac = 0x3c088908;
        uStack_18a8 = 0x3c088908;
        uStack_18a4 = 0x3c088908;
        local_1dc0 = local_1dc0 + 0.008333452;
        fStack_1dbc = fStack_1dbc + 0.008333452;
        fStack_1db8 = fStack_1db8 + 0.008333452;
        fStack_1db4 = fStack_1db4 + 0.008333452;
        fStack_1db0 = fStack_1db0 + 0.008333452;
        fStack_1dac = fStack_1dac + 0.008333452;
        fStack_1da8 = fStack_1da8 + 0.008333452;
        local_1ba0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1b98 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1b90 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1b88 = CONCAT44(0x3c22b327,fStack_1da8);
        local_1bc0 = local_1ce0._0_8_;
        uStack_1bb8 = local_1ce0._8_8_;
        uStack_1bb0 = local_1ce0._16_8_;
        uStack_1ba8 = local_1ce0._24_8_;
        local_1dc0 = local_1dc0 * (float)local_1ae0;
        fStack_1dbc = fStack_1dbc * local_1ae0._4_4_;
        fStack_1db8 = fStack_1db8 * (float)uStack_1ad8;
        fStack_1db4 = fStack_1db4 * uStack_1ad8._4_4_;
        fStack_1db0 = fStack_1db0 * (float)uStack_1ad0;
        fStack_1dac = fStack_1dac * uStack_1ad0._4_4_;
        fStack_1da8 = fStack_1da8 * (float)uStack_1ac8;
        local_18e0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_18d8 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_18d0 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_18c8 = CONCAT44(0x3c22b327,fStack_1da8);
        local_1900 = 0x3d2aa9c1;
        uStack_18fc = 0x3d2aa9c1;
        uStack_18f8 = 0x3d2aa9c1;
        uStack_18f4 = 0x3d2aa9c1;
        uStack_18f0 = 0x3d2aa9c1;
        uStack_18ec = 0x3d2aa9c1;
        uStack_18e8 = 0x3d2aa9c1;
        uStack_18e4 = 0x3d2aa9c1;
        local_1dc0 = local_1dc0 + 0.041665796;
        fStack_1dbc = fStack_1dbc + 0.041665796;
        fStack_1db8 = fStack_1db8 + 0.041665796;
        fStack_1db4 = fStack_1db4 + 0.041665796;
        fStack_1db0 = fStack_1db0 + 0.041665796;
        fStack_1dac = fStack_1dac + 0.041665796;
        fStack_1da8 = fStack_1da8 + 0.041665796;
        local_1be0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1bd8 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1bd0 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1bc8 = CONCAT44(0x3d53568b,fStack_1da8);
        local_1c00 = local_1ce0._0_8_;
        uStack_1bf8 = local_1ce0._8_8_;
        uStack_1bf0 = local_1ce0._16_8_;
        uStack_1be8 = local_1ce0._24_8_;
        local_1dc0 = local_1dc0 * (float)local_1ae0;
        fStack_1dbc = fStack_1dbc * local_1ae0._4_4_;
        fStack_1db8 = fStack_1db8 * (float)uStack_1ad8;
        fStack_1db4 = fStack_1db4 * uStack_1ad8._4_4_;
        fStack_1db0 = fStack_1db0 * (float)uStack_1ad0;
        fStack_1dac = fStack_1dac * uStack_1ad0._4_4_;
        fStack_1da8 = fStack_1da8 * (float)uStack_1ac8;
        local_1920 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1918 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1910 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1908 = CONCAT44(0x3d53568b,fStack_1da8);
        local_1940 = 0x3e2aaaaa;
        uStack_193c = 0x3e2aaaaa;
        uStack_1938 = 0x3e2aaaaa;
        uStack_1934 = 0x3e2aaaaa;
        uStack_1930 = 0x3e2aaaaa;
        uStack_192c = 0x3e2aaaaa;
        uStack_1928 = 0x3e2aaaaa;
        uStack_1924 = 0x3e2aaaaa;
        local_1dc0 = local_1dc0 + 0.16666666;
        fStack_1dbc = fStack_1dbc + 0.16666666;
        fStack_1db8 = fStack_1db8 + 0.16666666;
        fStack_1db4 = fStack_1db4 + 0.16666666;
        fStack_1db0 = fStack_1db0 + 0.16666666;
        fStack_1dac = fStack_1dac + 0.16666666;
        fStack_1da8 = fStack_1da8 + 0.16666666;
        local_1c20 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1c18 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1c10 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1c08 = CONCAT44(0x3e5f804d,fStack_1da8);
        local_1c40 = local_1ce0._0_8_;
        uStack_1c38 = local_1ce0._8_8_;
        uStack_1c30 = local_1ce0._16_8_;
        uStack_1c28 = local_1ce0._24_8_;
        local_1dc0 = local_1dc0 * (float)local_1ae0;
        fStack_1dbc = fStack_1dbc * local_1ae0._4_4_;
        fStack_1db8 = fStack_1db8 * (float)uStack_1ad8;
        fStack_1db4 = fStack_1db4 * uStack_1ad8._4_4_;
        fStack_1db0 = fStack_1db0 * (float)uStack_1ad0;
        fStack_1dac = fStack_1dac * uStack_1ad0._4_4_;
        fStack_1da8 = fStack_1da8 * (float)uStack_1ac8;
        local_1960 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1958 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1950 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1948 = CONCAT44(0x3e5f804d,fStack_1da8);
        local_1980 = 0x3f000000;
        uStack_197c = 0x3f000000;
        uStack_1978 = 0x3f000000;
        uStack_1974 = 0x3f000000;
        uStack_1970 = 0x3f000000;
        uStack_196c = 0x3f000000;
        uStack_1968 = 0x3f000000;
        uStack_1964 = 0x3f000000;
        local_1dc0 = local_1dc0 + 0.5;
        fStack_1dbc = fStack_1dbc + 0.5;
        fStack_1db8 = fStack_1db8 + 0.5;
        fStack_1db4 = fStack_1db4 + 0.5;
        fStack_1db0 = fStack_1db0 + 0.5;
        fStack_1dac = fStack_1dac + 0.5;
        fStack_1da8 = fStack_1da8 + 0.5;
        local_1c60 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1c58 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1c50 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1c48 = CONCAT44(0x3f37e013,fStack_1da8);
        local_1c80 = CONCAT44(fStack_1d9c,local_1da0);
        uStack_1c78 = CONCAT44(fStack_1d94,fStack_1d98);
        uStack_1c70 = CONCAT44(fStack_1d8c,fStack_1d90);
        uStack_1c68 = CONCAT44(uStack_1ac8._4_4_,fStack_1d88);
        local_1dc0 = local_1dc0 * local_1da0;
        fStack_1dbc = fStack_1dbc * fStack_1d9c;
        fStack_1db8 = fStack_1db8 * fStack_1d98;
        fStack_1db4 = fStack_1db4 * fStack_1d94;
        fStack_1db0 = fStack_1db0 * fStack_1d90;
        fStack_1dac = fStack_1dac * fStack_1d8c;
        fStack_1da8 = fStack_1da8 * fStack_1d88;
        local_19a0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1998 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1990 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1988 = CONCAT44(0x3f37e013,fStack_1da8);
        local_19c0 = local_1ce0._0_8_;
        uStack_19b8 = local_1ce0._8_8_;
        uStack_19b0 = local_1ce0._16_8_;
        uStack_19a8 = local_1ce0._24_8_;
        local_1dc0 = local_1dc0 + (float)local_1ae0;
        fStack_1dbc = fStack_1dbc + local_1ae0._4_4_;
        fStack_1db8 = fStack_1db8 + (float)uStack_1ad8;
        fStack_1db4 = fStack_1db4 + uStack_1ad8._4_4_;
        fStack_1db0 = fStack_1db0 + (float)uStack_1ad0;
        fStack_1dac = fStack_1dac + uStack_1ad0._4_4_;
        fStack_1da8 = fStack_1da8 + (float)uStack_1ac8;
        local_19e0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_19d8 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_19d0 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_19c8 = CONCAT44(uStack_1ac8._4_4_ + 0.71826285,fStack_1da8);
        local_1a00 = 0x3f8000003f800000;
        uStack_19f8 = 0x3f8000003f800000;
        uStack_19f0 = 0x3f8000003f800000;
        uStack_19e8 = 0x3f8000003f800000;
        local_1dc0 = local_1dc0 + 1.0;
        fStack_1dbc = fStack_1dbc + 1.0;
        fStack_1db8 = fStack_1db8 + 1.0;
        fStack_1db4 = fStack_1db4 + 1.0;
        fStack_1db0 = fStack_1db0 + 1.0;
        fStack_1dac = fStack_1dac + 1.0;
        fStack_1da8 = fStack_1da8 + 1.0;
        fStack_1da4 = uStack_1ac8._4_4_ + 0.71826285 + 1.0;
        local_e00 = local_1d20;
        uStack_df8 = uStack_1d18;
        uStack_df0 = uStack_1d10;
        uStack_de8 = uStack_1d08;
        local_1d40._4_4_ = (int)local_1a60._4_4_;
        local_1d40._0_4_ = (int)(float)local_1a60;
        local_1d40._8_4_ = (int)(float)uStack_1a58;
        local_1d40._12_4_ = (int)uStack_1a58._4_4_;
        local_1d40._16_4_ = (int)(float)uStack_1a50;
        local_1d40._20_4_ = (int)uStack_1a50._4_4_;
        auVar58 = local_1d40._0_24_;
        local_1d40._24_4_ = (int)(float)uStack_1a48;
        local_1d40._28_4_ = (int)uStack_1a48._4_4_;
        auVar6 = local_1d40;
        local_d80 = local_1d40._0_8_;
        uStack_d78 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar58._16_8_;
        uStack_d70 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar6._24_8_;
        uStack_d68 = local_1d40._24_8_;
        local_da0 = 0x7f0000007f;
        uStack_d98 = 0x7f0000007f;
        uStack_d90 = 0x7f0000007f;
        uStack_d88 = 0x7f0000007f;
        local_c80 = local_1d40._0_8_;
        uStack_c78 = local_1d40._8_8_;
        uStack_c70 = local_1d40._16_8_;
        uStack_c68 = local_1d40._24_8_;
        local_ca0 = 0x7f0000007f;
        uStack_c98 = 0x7f0000007f;
        uStack_c90 = 0x7f0000007f;
        uStack_c88 = 0x7f0000007f;
        auVar34._16_8_ = local_1d40._16_8_;
        auVar34._0_16_ = local_1d40._0_16_;
        auVar34._24_8_ = local_1d40._24_8_;
        auVar33._8_8_ = 0x7f0000007f;
        auVar33._0_8_ = 0x7f0000007f;
        auVar33._16_8_ = 0x7f0000007f;
        auVar33._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar34,auVar33);
        local_1d40._0_8_ = auVar6._0_8_;
        local_d00 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar6._8_8_;
        uStack_cf8 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar6._16_8_;
        uStack_cf0 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar6._24_8_;
        uStack_ce8 = local_1d40._24_8_;
        local_d04 = 0x17;
        local_c00 = local_1d40._0_8_;
        uStack_bf8 = local_1d40._8_8_;
        uStack_bf0 = local_1d40._16_8_;
        uStack_be8 = local_1d40._24_8_;
        local_c04 = 0x17;
        local_1d40 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_cc0 = local_1d40._0_8_;
        uStack_cb8 = local_1d40._8_8_;
        uStack_cb0 = local_1d40._16_8_;
        uStack_ca8 = local_1d40._24_8_;
        local_1de0 = local_1d40._0_8_;
        uStack_1dd8 = local_1d40._8_8_;
        uStack_1dd0 = local_1d40._16_8_;
        uStack_1dc8 = local_1d40._24_8_;
        local_1ca0 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1c98 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1c90 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1c88 = CONCAT44(fStack_1da4,fStack_1da8);
        local_1cc0._0_4_ = local_1d40._0_4_;
        local_1cc0._4_4_ = local_1d40._4_4_;
        uStack_1cb8._0_4_ = local_1d40._8_4_;
        uStack_1cb8._4_4_ = local_1d40._12_4_;
        uStack_1cb0._0_4_ = local_1d40._16_4_;
        uStack_1cb0._4_4_ = local_1d40._20_4_;
        uStack_1ca8._0_4_ = local_1d40._24_4_;
        local_1dc0 = local_1dc0 * (float)local_1cc0;
        fStack_1dbc = fStack_1dbc * local_1cc0._4_4_;
        fStack_1db8 = fStack_1db8 * (float)uStack_1cb8;
        fStack_1db4 = fStack_1db4 * uStack_1cb8._4_4_;
        fStack_1db0 = fStack_1db0 * (float)uStack_1cb0;
        fStack_1dac = fStack_1dac * uStack_1cb0._4_4_;
        fStack_1da8 = fStack_1da8 * (float)uStack_1ca8;
        local_1e60 = CONCAT44(fStack_1dbc,local_1dc0);
        uStack_1e58 = CONCAT44(fStack_1db4,fStack_1db8);
        uStack_1e50 = CONCAT44(fStack_1dac,fStack_1db0);
        uStack_1e48 = CONCAT44(fStack_1da4,fStack_1da8);
        local_1ee0 = (float)local_2140 + local_1dc0;
        fStack_1edc = local_2140._4_4_ + fStack_1dbc;
        fStack_1ed8 = (float)uStack_2138 + fStack_1db8;
        fStack_1ed4 = uStack_2138._4_4_ + fStack_1db4;
        fStack_1ed0 = (float)uStack_2130 + fStack_1db0;
        fStack_1ecc = uStack_2130._4_4_ + fStack_1dac;
        fStack_1ec8 = (float)uStack_2128 + fStack_1da8;
        fStack_1ec4 = uStack_2128._4_4_ + fStack_1da4;
        auVar18._16_4_ = (float)uStack_2130;
        auVar18._0_16_ = local_2060;
        auVar18._20_4_ = uStack_2130._4_4_;
        auVar18._24_4_ = (float)uStack_2128;
        auVar18._28_4_ = uStack_2128._4_4_;
        auVar17._4_4_ = fStack_1edc;
        auVar17._0_4_ = local_1ee0;
        auVar17._8_4_ = fStack_1ed8;
        auVar17._12_4_ = fStack_1ed4;
        auVar17._16_4_ = fStack_1ed0;
        auVar17._20_4_ = fStack_1ecc;
        auVar17._24_4_ = fStack_1ec8;
        auVar17._28_4_ = fStack_1ec4;
        auVar6 = vrcpps_avx(auVar17);
        auVar4._4_4_ = local_2140._4_4_ * auVar6._4_4_;
        auVar4._0_4_ = (float)local_2140 * auVar6._0_4_;
        auVar4._8_4_ = (float)uStack_2138 * auVar6._8_4_;
        auVar4._12_4_ = uStack_2138._4_4_ * auVar6._12_4_;
        auVar4._16_4_ = (float)uStack_2130 * auVar6._16_4_;
        auVar4._20_4_ = uStack_2130._4_4_ * auVar6._20_4_;
        auVar4._24_4_ = (float)uStack_2128 * auVar6._24_4_;
        auVar4._28_4_ = uStack_2128._4_4_;
        auVar2 = vfmsub213ps_fma(auVar4,auVar17,auVar18);
        auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar6,auVar4);
        local_21e0 = local_1fa0._0_8_;
        uStack_21d8 = local_1fa0._8_8_;
        uStack_21d0 = auStack_1f90._0_8_;
        uStack_21c8 = auStack_1f90._8_8_;
        local_2200 = local_1fe0._0_8_;
        uStack_21f8 = local_1fe0._8_8_;
        uStack_21f0 = auStack_1fd0._0_8_;
        uStack_21e8 = auStack_1fd0._8_8_;
        local_21c0 = ZEXT1632(auVar2);
        auVar5._16_8_ = auStack_1f90._0_8_;
        auVar5._0_16_ = local_1fa0;
        auVar5._24_8_ = auStack_1f90._8_8_;
        auVar6._16_8_ = auStack_1fd0._0_8_;
        auVar6._0_16_ = local_1fe0;
        auVar6._24_8_ = auStack_1fd0._8_8_;
        auVar64._8_4_ = 0x80000000;
        auVar64._0_8_ = 0x8000000080000000;
        auVar64._12_4_ = 0x80000000;
        auVar64._16_4_ = 0x80000000;
        auVar64._20_4_ = 0x80000000;
        auVar64._24_4_ = 0x80000000;
        auVar64._28_4_ = 0x80000000;
        auVar2 = vfmadd213ps_fma(auVar5,local_21c0,auVar6 ^ auVar64);
        local_2368 = local_25c0;
        local_2640 = auVar2._0_8_;
        local_23a0 = local_2640;
        uStack_2638 = auVar2._8_8_;
        uStack_2398 = uStack_2638;
        uStack_2390 = 0;
        uStack_2388 = 0;
        *local_25c0 = ZEXT1632(auVar2);
        local_25c0 = local_25c0 + 1;
        local_2140 = local_2060._0_8_;
        uStack_2138 = local_2060._8_8_;
        uStack_2130 = auStack_2050._0_8_;
        uStack_2128 = auStack_2050._8_8_;
        local_20a0 = local_1fa0._0_8_;
        uStack_2098 = local_1fa0._8_8_;
        uStack_2090 = auStack_1f90._0_8_;
        uStack_2088 = auStack_1f90._8_8_;
        local_2080 = uVar8;
        uStack_2078 = uVar9;
        uStack_2070 = uStack_2630;
        uStack_2068 = uStack_2408;
        local_203c = local_2040;
        local_2038 = local_2040;
        local_2034 = local_2040;
        local_2030 = local_2040;
        local_202c = local_2040;
        local_2028 = local_2040;
        local_2024 = local_2040;
        local_1fbc = local_1fc0;
        local_1fb8 = local_1fc0;
        local_1fb4 = local_1fc0;
        local_1fb0 = local_1fc0;
        local_1fac = local_1fc0;
        local_1fa8 = local_1fc0;
        local_1fa4 = local_1fc0;
        local_1f7c = local_1f80;
        local_1f78 = local_1f80;
        local_1f74 = local_1f80;
        local_1f70 = local_1f80;
        local_1f6c = local_1f80;
        local_1f68 = local_1f80;
        local_1f64 = local_1f80;
        local_1e40 = local_1ec0;
        fStack_1e3c = fStack_1ebc;
        fStack_1e38 = fStack_1eb8;
        fStack_1e34 = fStack_1eb4;
        fStack_1e30 = fStack_1eb0;
        fStack_1e2c = fStack_1eac;
        fStack_1e28 = fStack_1ea8;
        fStack_1e24 = fStack_1ea4;
        _local_1d00 = auVar25;
        local_1cc0 = local_1d40._0_8_;
        uStack_1cb8 = local_1d40._8_8_;
        uStack_1cb0 = local_1d40._16_8_;
        uStack_1ca8 = local_1d40._24_8_;
        local_1ae0 = local_1b00;
        uStack_1ad8 = uStack_1af8;
        uStack_1ad0 = uStack_1af0;
        uStack_1ac8 = uStack_1ae8;
        local_1a60 = local_1d20;
        uStack_1a58 = uStack_1d18;
        uStack_1a50 = uStack_1d10;
        uStack_1a48 = uStack_1d08;
        local_1a20 = uVar10;
        uStack_1a18 = uVar11;
        uStack_1a10 = uVar12;
        uStack_1a08 = uVar13;
        local_fe0 = local_1000;
      }
      for (; local_260c + 3 < local_24a0; local_260c = local_260c + 4) {
        local_2320 = local_25c0;
        local_22f0 = *(undefined8 *)*local_25c0;
        uStack_22e8 = *(undefined8 *)(*local_25c0 + 8);
        local_b14 = 0x3f800000;
        local_b30 = 0x3f800000;
        local_2300 = 0x3f8000003f800000;
        uStack_22f8 = 0x3f8000003f800000;
        local_b34 = 0x40000000;
        local_b50 = 0x40000000;
        local_2310 = 0x4000000040000000;
        uStack_2308 = 0x4000000040000000;
        local_a60._0_4_ = (float)local_22f0;
        local_a60._4_4_ = (float)((ulong)local_22f0 >> 0x20);
        uStack_a58._0_4_ = (float)uStack_22e8;
        uStack_a58._4_4_ = (float)((ulong)uStack_22e8 >> 0x20);
        local_9e0 = (float)local_a60 * 2.0;
        fStack_9dc = local_a60._4_4_ * 2.0;
        fStack_9d8 = (float)uStack_a58 * 2.0;
        fStack_9d4 = uStack_a58._4_4_ * 2.0;
        local_9b4 = 0x3f800000;
        local_9d0 = 0x3f800000;
        local_9f0 = 0x3f8000003f800000;
        uStack_9e8 = 0x3f8000003f800000;
        local_980._8_8_ = 0x3f8000003f800000;
        local_980._0_8_ = 0x3f8000003f800000;
        local_260 = ZEXT816(0) << 0x20;
        local_9a0 = 0;
        local_250._8_8_ = SUB168(ZEXT816(0),4);
        uStack_998 = local_250._8_8_;
        local_9b0 = CONCAT44(fStack_9dc,local_9e0);
        uStack_9a8 = CONCAT44(fStack_9d4,fStack_9d8);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_250._8_8_;
        auVar1._8_8_ = uStack_9a8;
        auVar1._0_8_ = local_9b0;
        auVar2 = vsubps_avx(auVar60 << 0x40,auVar1);
        local_8d0 = 0x3f800000;
        uStack_8cc = 0x3f800000;
        uStack_8c8 = 0x3f800000;
        uStack_8c4 = 0x3f800000;
        local_890._0_8_ = auVar2._0_8_;
        local_200 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_1f8 = local_890._8_8_;
        local_210 = 0x42b0c0a5;
        uStack_20c = 0x42b0c0a5;
        uStack_208 = 0x42b0c0a5;
        uStack_204 = 0x42b0c0a5;
        auVar45._8_4_ = 0x42b0c0a5;
        auVar45._0_8_ = 0x42b0c0a542b0c0a5;
        auVar45._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar45);
        local_890._0_8_ = auVar2._0_8_;
        local_1c0 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_1b8 = local_890._8_8_;
        local_1d0 = 0xc2b0c0a5;
        uStack_1cc = 0xc2b0c0a5;
        uStack_1c8 = 0xc2b0c0a5;
        uStack_1c4 = 0xc2b0c0a5;
        auVar47._8_4_ = 0xc2b0c0a5;
        auVar47._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar47._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar47);
        local_890._0_8_ = auVar3._0_8_;
        uVar8 = local_890._0_8_;
        local_890._8_8_ = auVar3._8_8_;
        uVar9 = local_890._8_8_;
        local_6e0 = 0x3fb8aa3b;
        uStack_6dc = 0x3fb8aa3b;
        uStack_6d8 = 0x3fb8aa3b;
        uStack_6d4 = 0x3fb8aa3b;
        local_6d0._0_4_ = auVar3._0_4_;
        local_6d0._4_4_ = auVar3._4_4_;
        uStack_6c8._0_4_ = auVar3._8_4_;
        uStack_6c8._4_4_ = auVar3._12_4_;
        local_8b0._4_4_ = local_6d0._4_4_ * 1.442695;
        local_8b0._0_4_ = (float)local_6d0 * 1.442695;
        uStack_8a8._0_4_ = (float)uStack_6c8 * 1.442695;
        uStack_8a8._4_4_ = uStack_6c8._4_4_ * 1.442695;
        local_5d0 = local_8b0;
        uStack_5c8 = uStack_8a8;
        local_5e0 = 0x3f000000;
        uStack_5dc = 0x3f000000;
        uStack_5d8 = 0x3f000000;
        uStack_5d4 = 0x3f000000;
        local_8b0._0_4_ = (float)local_6d0 * 1.442695 + 0.5;
        local_8b0._4_4_ = local_6d0._4_4_ * 1.442695 + 0.5;
        fVar65 = (float)uStack_6c8 * 1.442695 + 0.5;
        fVar66 = uStack_6c8._4_4_ * 1.442695 + 0.5;
        uStack_8a8._0_4_ = fVar65;
        uStack_8a8._4_4_ = fVar66;
        local_180 = local_8b0;
        uStack_178 = uStack_8a8;
        local_8c0._4_4_ = (int)(float)local_8b0._4_4_;
        local_8c0._0_4_ = (int)(float)local_8b0._0_4_;
        local_8c0._8_4_ = (int)fVar65;
        local_8c0._12_4_ = (int)fVar66;
        local_160 = local_8c0._0_8_;
        uStack_158 = local_8c0._8_8_;
        auVar49._8_8_ = local_8c0._8_8_;
        auVar49._0_8_ = local_8c0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar49);
        local_8a0 = auVar1._0_8_;
        local_120 = local_8a0;
        uStack_898 = auVar1._8_8_;
        uStack_118 = uStack_898;
        local_130 = local_8b0;
        uStack_128 = uStack_8a8;
        auVar51._8_8_ = uStack_8a8;
        auVar51._0_8_ = local_8b0;
        auVar2 = vcmpps_avx(auVar51,auVar1,1);
        local_8e0._0_8_ = auVar2._0_8_;
        local_e0 = local_8e0._0_8_;
        local_8e0._8_8_ = auVar2._8_8_;
        uStack_d8 = local_8e0._8_8_;
        local_f0 = 0x3f8000003f800000;
        uStack_e8 = 0x3f8000003f800000;
        auVar53._8_8_ = 0x3f8000003f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        local_8e0 = vpand_avx(auVar2,auVar53);
        local_830 = local_8a0;
        uStack_828 = uStack_898;
        local_840 = local_8e0._0_8_;
        uStack_838 = local_8e0._8_8_;
        _local_8b0 = vsubps_avx(auVar1,local_8e0);
        local_700 = 0x3f318000;
        uStack_6fc = 0x3f318000;
        uStack_6f8 = 0x3f318000;
        uStack_6f4 = 0x3f318000;
        local_6f0._0_4_ = local_8b0._0_4_;
        local_6f0._4_4_ = local_8b0._4_4_;
        uStack_6e8._0_4_ = local_8b0._8_4_;
        uStack_6e8._4_4_ = local_8b0._12_4_;
        local_8a0 = CONCAT44(local_6f0._4_4_ * 0.6933594,(float)local_6f0 * 0.6933594);
        uStack_898._0_4_ = (float)uStack_6e8 * 0.6933594;
        uStack_898._4_4_ = uStack_6e8._4_4_ * 0.6933594;
        local_710 = local_8b0;
        uStack_708 = uStack_8a8;
        local_720 = 0xb95e8083;
        uStack_71c = 0xb95e8083;
        uStack_718 = 0xb95e8083;
        uStack_714 = 0xb95e8083;
        local_850 = local_890._0_8_;
        uStack_848 = local_890._8_8_;
        local_860 = local_8a0;
        uStack_858 = uStack_898;
        auVar41._8_8_ = uStack_898;
        auVar41._0_8_ = local_8a0;
        auVar2 = vsubps_avx(auVar3,auVar41);
        local_890._0_8_ = auVar2._0_8_;
        local_870 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_868 = local_890._8_8_;
        local_880 = CONCAT44(local_6f0._4_4_ * -0.00021219444,(float)local_6f0 * -0.00021219444);
        uStack_878 = CONCAT44(uStack_6e8._4_4_ * -0.00021219444,(float)uStack_6e8 * -0.00021219444);
        auVar40._8_8_ = uStack_878;
        auVar40._0_8_ = local_880;
        local_890 = vsubps_avx(auVar2,auVar40);
        local_740 = local_890._0_8_;
        uStack_738 = local_890._8_8_;
        local_730._0_4_ = local_890._0_4_;
        local_730._4_4_ = local_890._4_4_;
        uStack_728._0_4_ = local_890._8_4_;
        uStack_728._4_4_ = local_890._12_4_;
        local_8f0 = (float)local_730 * (float)local_730;
        fStack_8ec = local_730._4_4_ * local_730._4_4_;
        fStack_8e8 = (float)uStack_728 * (float)uStack_728;
        fStack_8e4 = uStack_728._4_4_ * uStack_728._4_4_;
        local_750 = 0x3950696739506967;
        uStack_748 = 0x3950696739506967;
        local_760 = local_890._0_8_;
        uStack_758 = local_890._8_8_;
        local_5f0 = CONCAT44(local_730._4_4_ * 0.00019875691,(float)local_730 * 0.00019875691);
        uStack_5e8 = CONCAT44(uStack_728._4_4_ * 0.00019875691,(float)uStack_728 * 0.00019875691);
        local_600 = 0x3ab743ce;
        uStack_5fc = 0x3ab743ce;
        uStack_5f8 = 0x3ab743ce;
        uStack_5f4 = 0x3ab743ce;
        local_900 = (float)local_730 * 0.00019875691 + 0.0013981999;
        fStack_8fc = local_730._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_8f8 = (float)uStack_728 * 0.00019875691 + 0.0013981999;
        fStack_8f4 = uStack_728._4_4_ * 0.00019875691 + 0.0013981999;
        local_770 = CONCAT44(fStack_8fc,local_900);
        uStack_768 = CONCAT44(fStack_8f4,fStack_8f8);
        local_780 = local_890._0_8_;
        uStack_778 = local_890._8_8_;
        local_900 = local_900 * (float)local_730;
        fStack_8fc = fStack_8fc * local_730._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_728;
        fStack_8f4 = fStack_8f4 * uStack_728._4_4_;
        local_610 = CONCAT44(fStack_8fc,local_900);
        uStack_608 = CONCAT44(fStack_8f4,fStack_8f8);
        local_620 = 0x3c088908;
        uStack_61c = 0x3c088908;
        uStack_618 = 0x3c088908;
        uStack_614 = 0x3c088908;
        local_900 = local_900 + 0.008333452;
        fStack_8fc = fStack_8fc + 0.008333452;
        fStack_8f8 = fStack_8f8 + 0.008333452;
        fStack_8f4 = fStack_8f4 + 0.008333452;
        local_790 = CONCAT44(fStack_8fc,local_900);
        uStack_788 = CONCAT44(fStack_8f4,fStack_8f8);
        local_7a0 = local_890._0_8_;
        uStack_798 = local_890._8_8_;
        local_900 = local_900 * (float)local_730;
        fStack_8fc = fStack_8fc * local_730._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_728;
        fStack_8f4 = fStack_8f4 * uStack_728._4_4_;
        local_630 = CONCAT44(fStack_8fc,local_900);
        uStack_628 = CONCAT44(fStack_8f4,fStack_8f8);
        local_640 = 0x3d2aa9c1;
        uStack_63c = 0x3d2aa9c1;
        uStack_638 = 0x3d2aa9c1;
        uStack_634 = 0x3d2aa9c1;
        local_900 = local_900 + 0.041665796;
        fStack_8fc = fStack_8fc + 0.041665796;
        fStack_8f8 = fStack_8f8 + 0.041665796;
        fStack_8f4 = fStack_8f4 + 0.041665796;
        local_7b0 = CONCAT44(fStack_8fc,local_900);
        uStack_7a8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_7c0 = local_890._0_8_;
        uStack_7b8 = local_890._8_8_;
        local_900 = local_900 * (float)local_730;
        fStack_8fc = fStack_8fc * local_730._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_728;
        fStack_8f4 = fStack_8f4 * uStack_728._4_4_;
        local_650 = CONCAT44(fStack_8fc,local_900);
        uStack_648 = CONCAT44(fStack_8f4,fStack_8f8);
        local_660 = 0x3e2aaaaa;
        uStack_65c = 0x3e2aaaaa;
        uStack_658 = 0x3e2aaaaa;
        uStack_654 = 0x3e2aaaaa;
        local_900 = local_900 + 0.16666666;
        fStack_8fc = fStack_8fc + 0.16666666;
        fStack_8f8 = fStack_8f8 + 0.16666666;
        fStack_8f4 = fStack_8f4 + 0.16666666;
        local_7d0 = CONCAT44(fStack_8fc,local_900);
        uStack_7c8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_7e0 = local_890._0_8_;
        uStack_7d8 = local_890._8_8_;
        local_900 = local_900 * (float)local_730;
        fStack_8fc = fStack_8fc * local_730._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_728;
        fStack_8f4 = fStack_8f4 * uStack_728._4_4_;
        local_670 = CONCAT44(fStack_8fc,local_900);
        uStack_668 = CONCAT44(fStack_8f4,fStack_8f8);
        local_680 = 0x3f000000;
        uStack_67c = 0x3f000000;
        uStack_678 = 0x3f000000;
        uStack_674 = 0x3f000000;
        local_900 = local_900 + 0.5;
        fStack_8fc = fStack_8fc + 0.5;
        fStack_8f8 = fStack_8f8 + 0.5;
        fStack_8f4 = fStack_8f4 + 0.5;
        local_7f0 = CONCAT44(fStack_8fc,local_900);
        uStack_7e8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_800 = CONCAT44(fStack_8ec,local_8f0);
        uStack_7f8 = CONCAT44(fStack_8e4,fStack_8e8);
        local_900 = local_900 * local_8f0;
        fStack_8fc = fStack_8fc * fStack_8ec;
        fStack_8f8 = fStack_8f8 * fStack_8e8;
        fStack_8f4 = fStack_8f4 * fStack_8e4;
        local_690 = CONCAT44(fStack_8fc,local_900);
        uStack_688 = CONCAT44(fStack_8f4,fStack_8f8);
        local_6a0 = local_890._0_8_;
        uStack_698 = local_890._8_8_;
        local_900 = local_900 + (float)local_730;
        fStack_8fc = fStack_8fc + local_730._4_4_;
        fStack_8f8 = fStack_8f8 + (float)uStack_728;
        fStack_8f4 = fStack_8f4 + uStack_728._4_4_;
        local_6b0 = CONCAT44(fStack_8fc,local_900);
        uStack_6a8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_6c0 = 0x3f8000003f800000;
        uStack_6b8 = 0x3f8000003f800000;
        local_900 = local_900 + 1.0;
        fStack_8fc = fStack_8fc + 1.0;
        fStack_8f8 = fStack_8f8 + 1.0;
        fStack_8f4 = fStack_8f4 + 1.0;
        local_190 = local_8b0;
        uStack_188 = uStack_8a8;
        local_8c0._4_4_ = (int)local_6f0._4_4_;
        local_8c0._0_4_ = (int)(float)local_6f0;
        local_8c0._8_4_ = (int)(float)uStack_6e8;
        local_8c0._12_4_ = (int)uStack_6e8._4_4_;
        local_a0 = local_8c0._0_8_;
        uStack_98 = local_8c0._8_8_;
        local_b0 = 0x7f0000007f;
        uStack_a8 = 0x7f0000007f;
        auVar57._8_8_ = local_8c0._8_8_;
        auVar57._0_8_ = local_8c0._0_8_;
        auVar56._8_8_ = 0x7f0000007f;
        auVar56._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar57,auVar56);
        local_8c0._0_8_ = auVar2._0_8_;
        local_60 = local_8c0._0_8_;
        local_8c0._8_8_ = auVar2._8_8_;
        uStack_58 = local_8c0._8_8_;
        local_64 = 0x17;
        local_8c0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_8c0._0_8_;
        uStack_38 = local_8c0._8_8_;
        local_910 = local_8c0._0_8_;
        uStack_908 = local_8c0._8_8_;
        local_810._4_4_ = fStack_8fc;
        local_810._0_4_ = local_900;
        local_810._8_4_ = fStack_8f8;
        local_810._12_4_ = fStack_8f4;
        local_820._0_4_ = local_8c0._0_4_;
        local_820._4_4_ = local_8c0._4_4_;
        uStack_818._0_4_ = local_8c0._8_4_;
        uStack_818._4_4_ = local_8c0._12_4_;
        local_900 = local_900 * (float)local_820;
        fStack_8fc = fStack_8fc * local_820._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_818;
        fStack_8f4 = fStack_8f4 * uStack_818._4_4_;
        local_950 = CONCAT44(fStack_8fc,local_900);
        uStack_948 = CONCAT44(fStack_8f4,fStack_8f8);
        local_990 = local_900 + 1.0;
        fStack_98c = fStack_8fc + 1.0;
        fStack_988 = fStack_8f8 + 1.0;
        fStack_984 = fStack_8f4 + 1.0;
        auVar3._4_4_ = fStack_98c;
        auVar3._0_4_ = local_990;
        auVar3._8_4_ = fStack_988;
        auVar3._12_4_ = fStack_984;
        _local_a80 = vdivps_avx(local_980,auVar3);
        local_ae0._0_4_ = (float)local_a80._0_4_ * 2.0;
        local_ae0._4_4_ = (float)local_a80._4_4_ * 2.0;
        local_ae0._8_4_ = fStack_a78 * 2.0;
        local_ae0._12_4_ = fStack_a74 * 2.0;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(local_ae0,auVar2);
        local_2298 = local_25c0;
        local_2650 = auVar2._0_8_;
        local_22b0 = local_2650;
        uStack_2648 = auVar2._8_8_;
        uStack_22a8 = uStack_2648;
        *(undefined1 (*) [16])*local_25c0 = auVar2;
        local_25c0 = (undefined1 (*) [32])(*local_25c0 + 0x10);
        uStack_b4c = local_b50;
        uStack_b48 = local_b50;
        uStack_b44 = local_b50;
        uStack_b2c = local_b30;
        uStack_b28 = local_b30;
        uStack_b24 = local_b30;
        local_af0 = local_2300;
        uStack_ae8 = uStack_22f8;
        local_a90 = local_2310;
        uStack_a88 = uStack_2308;
        local_a70 = local_2310;
        uStack_a68 = uStack_2308;
        local_a60 = local_22f0;
        uStack_a58 = uStack_22e8;
        uStack_9cc = local_9d0;
        uStack_9c8 = local_9d0;
        uStack_9c4 = local_9d0;
        local_940 = local_980;
        local_820 = local_8c0._0_8_;
        uStack_818 = local_8c0._8_8_;
        local_730 = local_740;
        uStack_728 = uStack_738;
        local_6f0 = local_8b0;
        uStack_6e8 = uStack_8a8;
        local_6d0 = uVar8;
        uStack_6c8 = uVar9;
        local_250 = local_260;
      }
      for (; local_260c < local_24a0; local_260c = local_260c + 1) {
        dVar62 = std::tanh((double)(ulong)*(uint *)*local_25c0);
        *(int *)*local_25c0 = SUB84(dVar62,0);
        local_25c0 = (undefined1 (*) [32])(*local_25c0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}